

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  int iVar11;
  int iVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  int *piVar16;
  Layer *pLVar17;
  undefined4 *puVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  Allocator *pAVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  void *pvVar39;
  undefined1 (*pauVar40) [16];
  _func_int ***ppp_Var41;
  int k;
  _func_int ***ppp_Var42;
  _func_int ***ppp_Var43;
  ulong uVar44;
  uint uVar45;
  int iVar46;
  long lVar47;
  pointer piVar48;
  pointer piVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  undefined1 (*pauVar54) [64];
  int j;
  int iVar55;
  long lVar56;
  uint uVar57;
  long lVar58;
  undefined1 (*pauVar59) [16];
  undefined1 (*pauVar60) [16];
  undefined1 (*pauVar61) [64];
  undefined1 (*pauVar62) [32];
  void *pvVar63;
  ulong uVar64;
  void *pvVar65;
  void *pvVar66;
  long lVar67;
  ulong uVar68;
  int j_2;
  size_t _elemsize;
  void *pvVar69;
  float *pfVar70;
  int j_3;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  void *pvVar71;
  ulong uVar72;
  _func_int ***ppp_Var73;
  bool bVar74;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  v4sf one;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 in_ZMM30 [64];
  ulong local_250;
  Mat local_228;
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined1 auVar93 [16];
  
  auVar90 = in_ZMM30._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar33 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar33;
  }
  uVar45 = bottom_blob->c;
  uVar64 = (ulong)uVar45;
  uVar68 = bottom_blob->elemsize;
  iVar33 = bottom_blob->elempack;
  iVar46 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar55 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar50 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar37 = (this->super_ConvolutionDepthWise).dilation_h;
  local_228.cstep = 0;
  local_228.data = (Allocator *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_228.elempack = 0;
  local_228.h = 0;
  local_228.allocator = (Allocator *)local_228.data;
  local_228.dims = (int)local_228.refcount;
  local_228.w = local_228.refcount._4_4_;
  local_228.d = (int)local_228.refcount;
  local_228.c = local_228.elempack;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_228,opt);
  iVar12 = local_228.w;
  iVar38 = -100;
  if (((Allocator *)local_228.data == (Allocator *)0x0) ||
     ((long)local_228.c * local_228.cstep == 0)) goto LAB_003a4c0e;
  iVar46 = (~((iVar46 + -1) * iVar50) + local_228.w) / (this->super_ConvolutionDepthWise).stride_w;
  iVar50 = iVar46 + 1;
  iVar55 = (~((iVar55 + -1) * iVar37) + local_228.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar36 = (this->super_ConvolutionDepthWise).num_output;
  if (opt->use_packing_layout == true) {
    if ((uVar36 & 0xf) == 0) {
      uVar57 = 0x10;
    }
    else if ((uVar36 & 7) == 0) {
      uVar57 = 8;
    }
    else {
      uVar57 = (uint)((uVar36 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar57 = 1;
  }
  _elemsize = (uVar68 / (ulong)(long)iVar33) * (ulong)uVar57;
  Mat::create(top_blob,iVar50,iVar55 + 1,(int)uVar36 / (int)uVar57,_elemsize,uVar57,
              opt->blob_allocator);
  sVar15 = local_228.cstep;
  iVar32 = local_228.c;
  iVar31 = local_228.d;
  iVar52 = local_228.h;
  iVar51 = local_228.w;
  pAVar30 = local_228.allocator;
  iVar37 = local_228.elempack;
  auVar81 = _DAT_00540070;
  pvVar63 = top_blob->data;
  if ((pvVar63 == (void *)0x0) || (sVar13 = top_blob->cstep, (long)top_blob->c * sVar13 == 0))
  goto LAB_003a4c0e;
  iVar38 = (this->super_ConvolutionDepthWise).num_output;
  iVar11 = (this->super_ConvolutionDepthWise).group;
  if (iVar11 != iVar38 || iVar33 * uVar45 != iVar11) {
LAB_003a2751:
    uVar68 = (long)(int)(iVar33 * uVar45) / (long)iVar11;
    uVar64 = (long)iVar38 / (long)iVar11;
    if (opt->use_packing_layout == true) {
      iVar46 = 0x10;
      uVar45 = 0x10;
      if ((uVar68 & 0xf) != 0) {
        if ((uVar68 & 7) == 0) {
          iVar46 = 8;
        }
        else {
          iVar46 = (uint)((uVar68 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar64 & 0xf) != 0) {
        if ((uVar64 & 7) == 0) {
          uVar45 = 8;
        }
        else {
          uVar45 = (uint)((uVar64 & 3) == 0) * 3 + 1;
        }
      }
    }
    else {
      iVar46 = 1;
      uVar45 = 1;
    }
    piVar16 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_228.data;
    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_228.elemsize;
    uVar28._4_4_ = local_228.w;
    uVar28._0_4_ = local_228.dims;
    uVar29._4_4_ = local_228.d;
    uVar29._0_4_ = local_228.h;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    local_250 = uVar64 & 0xffffffff;
    uVar44 = uVar64;
    if (iVar46 < iVar33) {
      opt_p.lightmode = opt->lightmode;
      opt_p.use_shader_pack8 = opt->use_shader_pack8;
      opt_p.use_subgroup_ops = opt->use_subgroup_ops;
      opt_p.use_reserved_0 = opt->use_reserved_0;
      opt_p.num_threads = opt->num_threads;
      opt_p.workspace_allocator = opt->workspace_allocator;
      opt_p.openmp_blocktime = opt->openmp_blocktime;
      opt_p.use_winograd_convolution = opt->use_winograd_convolution;
      opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_p.use_int8_inference = opt->use_int8_inference;
      opt_p.use_vulkan_compute = opt->use_vulkan_compute;
      opt_p.use_bf16_storage = opt->use_bf16_storage;
      opt_p.use_fp16_packed = opt->use_fp16_packed;
      opt_p.use_fp16_storage = opt->use_fp16_storage;
      opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_p.use_int8_packed = opt->use_int8_packed;
      opt_p.use_int8_storage = opt->use_int8_storage;
      opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_p.use_packing_layout = opt->use_packing_layout;
      opt_p.vulkan_device_index = opt->vulkan_device_index;
      opt_p.use_reserved_1 = opt->use_reserved_1;
      opt_p.use_image_storage = opt->use_image_storage;
      opt_p.use_tensor_storage = opt->use_tensor_storage;
      opt_p.use_reserved_2 = opt->use_reserved_2;
      opt_p.flush_denormals = opt->flush_denormals;
      opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_p.use_shader_local_memory = opt->use_shader_local_memory;
      opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_p.use_fp16_uniform = opt->use_fp16_uniform;
      opt_p.use_int8_uniform = opt->use_int8_uniform;
      opt_p.use_reserved_9 = opt->use_reserved_9;
      opt_p.use_reserved_10 = opt->use_reserved_10;
      opt_p.use_reserved_11 = opt->use_reserved_11;
      opt_p.blob_allocator = opt->workspace_allocator;
      convert_packing(&local_228,(Mat *)&_space_ofs,iVar46,&opt_p);
      if ((_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start != (pointer)0x0) && (uVar44 = uVar64 & 0xffffffff, (long)iVar32 * sVar15 != 0))
      goto LAB_003a28b7;
      iVar38 = -100;
    }
    else {
LAB_003a28b7:
      piVar16 = top_blob->refcount;
      opt_p._0_8_ = top_blob->data;
      opt_p.blob_allocator = (Allocator *)top_blob->refcount;
      opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
      opt_p.openmp_blocktime = top_blob->elempack;
      opt_p._32_8_ = top_blob->allocator;
      opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
      opt_p._48_8_ = *(undefined8 *)&top_blob->h;
      opt_p._56_4_ = top_blob->c;
      sVar13 = top_blob->cstep;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      if (uVar45 < uVar57) {
        Mat::create((Mat *)&opt_p,iVar50,iVar55 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar45,
                    (ulong)uVar45 * (_elemsize / uVar57),uVar45,opt->workspace_allocator);
        iVar38 = -100;
        if (opt_p._0_8_ != 0) {
          uVar44 = uVar64 & 0xffffffff;
          if ((long)(int)opt_p._56_4_ * sVar13 != 0) goto LAB_003a299d;
        }
      }
      else {
LAB_003a299d:
        iVar33 = 0;
        iVar55 = 0;
        lVar53 = 0;
        do {
          if ((this->super_ConvolutionDepthWise).group <= lVar53) {
            if (uVar45 < uVar57) {
              convert_packing((Mat *)&opt_p,top_blob,uVar57,opt);
              iVar38 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              break;
            }
            else if ((Mat *)&opt_p != top_blob) {
              if (opt_p.blob_allocator != (Allocator *)0x0) {
                LOCK();
                *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                     *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                UNLOCK();
              }
              piVar16 = top_blob->refcount;
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = (void *)opt_p._0_8_;
              top_blob->refcount = (int *)opt_p.blob_allocator;
              top_blob->elemsize = (size_t)opt_p.workspace_allocator;
              top_blob->elempack = opt_p.openmp_blocktime;
              top_blob->allocator = (Allocator *)opt_p._32_8_;
              *(undefined8 *)&top_blob->dims = opt_p._40_8_;
              *(undefined8 *)&top_blob->h = opt_p._48_8_;
              top_blob->c = opt_p._56_4_;
              top_blob->cstep = sVar13;
            }
            iVar38 = 0;
            break;
          }
          m.c = (int)uVar68 / iVar46;
          m.data = (void *)((long)(iVar33 / iVar46) * sVar15 *
                            (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
          m.refcount = (int *)0x0;
          m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          m.elempack = iVar37;
          m.allocator = pAVar30;
          m.cstep = ((long)iVar31 *
                     (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage * (long)iVar52 * (long)iVar51 +
                     0xfU & 0xfffffffffffffff0) /
                    (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          m_1.c = (int)uVar44 / (int)uVar45;
          m_1.data = (void *)((long)(iVar55 / (int)uVar45) * sVar13 *
                              (long)opt_p.workspace_allocator + opt_p._0_8_);
          m_1.refcount = (int *)0x0;
          m_1.elemsize = (size_t)opt_p.workspace_allocator;
          m_1.elempack = opt_p.openmp_blocktime;
          m_1.allocator = (Allocator *)opt_p._32_8_;
          m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                       (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                      0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
          m_1._40_8_ = opt_p._40_8_;
          m_1._48_8_ = opt_p._48_8_;
          pLVar17 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar53];
          opt_g.lightmode = opt->lightmode;
          opt_g.use_shader_pack8 = opt->use_shader_pack8;
          opt_g.use_subgroup_ops = opt->use_subgroup_ops;
          opt_g.use_reserved_0 = opt->use_reserved_0;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.openmp_blocktime = opt->openmp_blocktime;
          opt_g.use_winograd_convolution = opt->use_winograd_convolution;
          opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
          opt_g.use_int8_inference = opt->use_int8_inference;
          opt_g.use_vulkan_compute = opt->use_vulkan_compute;
          opt_g.use_bf16_storage = opt->use_bf16_storage;
          opt_g.use_fp16_packed = opt->use_fp16_packed;
          opt_g.use_fp16_storage = opt->use_fp16_storage;
          opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_g.use_int8_packed = opt->use_int8_packed;
          opt_g.use_int8_storage = opt->use_int8_storage;
          opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_g.use_packing_layout = opt->use_packing_layout;
          opt_g.vulkan_device_index = opt->vulkan_device_index;
          opt_g.use_reserved_1 = opt->use_reserved_1;
          opt_g.use_image_storage = opt->use_image_storage;
          opt_g.use_tensor_storage = opt->use_tensor_storage;
          opt_g.use_reserved_2 = opt->use_reserved_2;
          opt_g.flush_denormals = opt->flush_denormals;
          opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
          opt_g.use_shader_local_memory = opt->use_shader_local_memory;
          opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
          opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
          opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
          opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
          opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          opt_g.use_fp16_uniform = opt->use_fp16_uniform;
          opt_g.use_int8_uniform = opt->use_int8_uniform;
          opt_g.use_reserved_9 = opt->use_reserved_9;
          opt_g.use_reserved_10 = opt->use_reserved_10;
          opt_g.use_reserved_11 = opt->use_reserved_11;
          opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
          m._40_8_ = uVar28;
          m._48_8_ = uVar29;
          iVar38 = (*pLVar17->_vptr_Layer[7])(pLVar17,&m,&m_1,&opt_g);
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + -1;
            UNLOCK();
            if (*m.refcount == 0) {
              if (m.allocator == (Allocator *)0x0) {
                free(m.data);
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          lVar53 = lVar53 + 1;
          iVar55 = iVar55 + (int)uVar64;
          iVar33 = iVar33 + (int)uVar68;
          uVar44 = local_250;
        } while (iVar38 == 0);
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      LOCK();
      *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      UNLOCK();
      if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish == 0) {
        if (pAVar30 == (Allocator *)0x0) {
          free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
        else {
          (*pAVar30->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003a4c0e;
  }
  if (iVar33 == 1) {
    auVar90._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar90._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar90._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar90._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    uVar68 = vpcmpd_avx512vl(auVar90,_DAT_00538180,4);
    iVar46 = (this->super_ConvolutionDepthWise).stride_w;
    iVar12 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar12 == 1 && iVar46 == 1) && (uVar68 & 0xf) == 0) {
      lVar58 = (long)local_228.w;
      iVar33 = top_blob->w;
      iVar46 = top_blob->h;
      pvVar69 = (this->super_ConvolutionDepthWise).bias_data.data;
      pvVar14 = (this->weight_data_tm).data;
      sVar15 = top_blob->elemsize;
      lVar53 = (long)iVar33;
      uVar64 = 0;
      uVar68 = (ulong)(uint)local_228.c;
      if (local_228.c < 1) {
        uVar68 = uVar64;
      }
      lVar47 = (long)(local_228.w + 2) * 4;
      for (; uVar64 != uVar68; uVar64 = uVar64 + 1) {
        if (pvVar69 == (void *)0x0) {
          fVar131 = 0.0;
        }
        else {
          fVar131 = *(float *)((long)pvVar69 + uVar64 * 4);
        }
        pvVar66 = (void *)(sVar13 * sVar15 * uVar64 + (long)pvVar63);
        lVar56 = uVar64 * 0x24;
        ppp_Var43 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.elemsize * local_228.cstep * uVar64);
        piVar49 = (pointer)((long)ppp_Var43 + lVar58 * 4);
        ppp_Var41 = ppp_Var43 + lVar58;
        piVar48 = (pointer)((long)ppp_Var43 + lVar58 * 0xc);
        pvVar39 = pvVar66;
        for (uVar45 = 0; (int)(uVar45 | 1) < iVar46; uVar45 = uVar45 + 2) {
          lVar67 = 0;
          for (iVar55 = iVar33; 0 < iVar55; iVar55 = iVar55 + -1) {
            auVar134 = *(undefined1 (*) [32])((long)pvVar14 + lVar56);
            auVar84._8_8_ = 0;
            auVar84._0_8_ = *(ulong *)((long)ppp_Var43 + lVar67 + 4);
            auVar90 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var43 + lVar67)),auVar84);
            auVar90 = vshufps_avx(auVar90,auVar84,0xd8);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)piVar49 + lVar67)),0x30);
            uVar44 = *(ulong *)((long)piVar49 + lVar67 + 4);
            auVar86._8_8_ = 0;
            auVar86._0_8_ = uVar44;
            auVar107._16_8_ = uVar44;
            auVar107._0_16_ = auVar90;
            auVar107._24_8_ = 0;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = *(ulong *)((long)ppp_Var41 + lVar67);
            auVar137._16_8_ = *(ulong *)((long)ppp_Var41 + lVar67);
            auVar137._0_16_ = auVar90;
            auVar137._24_8_ = 0;
            auVar111 = vshufpd_avx(auVar107,auVar137,2);
            auVar85._0_4_ = auVar134._0_4_ * auVar111._0_4_;
            auVar85._4_4_ = auVar134._4_4_ * auVar111._4_4_;
            auVar85._8_4_ = auVar134._8_4_ * auVar111._8_4_;
            auVar85._12_4_ = auVar134._12_4_ * auVar111._12_4_;
            auVar102._16_4_ = auVar134._16_4_ * auVar111._16_4_;
            auVar102._0_16_ = auVar85;
            auVar102._20_4_ = auVar134._20_4_ * auVar111._20_4_;
            auVar102._24_4_ = auVar134._24_4_ * auVar111._24_4_;
            auVar102._28_4_ = auVar111._28_4_;
            auVar90 = vhaddps_avx(auVar102._16_16_,auVar85);
            auVar90 = vhaddps_avx(auVar90,auVar90);
            auVar90 = vhaddps_avx(auVar90,auVar90);
            uVar2 = *(undefined4 *)((long)(ppp_Var41 + 1) + lVar67);
            auVar87._4_4_ = uVar2;
            auVar87._0_4_ = uVar2;
            auVar87._8_4_ = uVar2;
            auVar87._12_4_ = uVar2;
            auVar112._16_4_ = uVar2;
            auVar112._0_16_ = auVar87;
            auVar112._20_4_ = uVar2;
            auVar112._24_4_ = uVar2;
            auVar112._28_4_ = uVar2;
            auVar82 = vshufps_avx(auVar88,auVar86,0x41);
            auVar111 = vpermt2ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar81),auVar134);
            auVar113._16_8_ = *(undefined8 *)((long)piVar48 + lVar67);
            auVar113._0_16_ = auVar111._0_16_;
            auVar113._24_8_ = 0;
            auVar111 = vblendps_avx(auVar111,auVar112,0x20);
            auVar111 = vshufpd_avx(auVar111,auVar113,2);
            auVar134 = vblendps_avx(auVar134,ZEXT432(*(uint *)((long)piVar49 + lVar67)),1);
            auVar83._0_4_ = auVar111._0_4_ * auVar134._0_4_;
            auVar83._4_4_ = auVar111._4_4_ * auVar134._4_4_;
            auVar83._8_4_ = auVar111._8_4_ * auVar134._8_4_;
            auVar83._12_4_ = auVar111._12_4_ * auVar134._12_4_;
            auVar103._16_4_ = auVar111._16_4_ * auVar134._16_4_;
            auVar103._0_16_ = auVar83;
            auVar103._20_4_ = auVar111._20_4_ * auVar134._20_4_;
            auVar103._24_4_ = auVar111._24_4_ * auVar134._24_4_;
            auVar103._28_4_ = auVar134._28_4_;
            auVar82 = vhaddps_avx(auVar103._16_16_,auVar83);
            auVar82 = vhaddps_avx(auVar82,auVar82);
            auVar84 = ZEXT416(*(uint *)((long)pvVar14 + lVar56 + 0x20));
            auVar83 = vfmadd231ss_fma(auVar90,auVar84,auVar87);
            auVar90 = vhaddps_avx(auVar82,auVar82);
            auVar90 = vfmadd231ss_fma(auVar90,auVar84,ZEXT416(*(uint *)((long)piVar48 + lVar67 + 8))
                                     );
            *(float *)((long)pvVar39 + lVar67) = auVar83._0_4_ + fVar131;
            *(float *)((long)pvVar66 + lVar67 + lVar53 * 4) = auVar90._0_4_ + fVar131;
            lVar67 = lVar67 + 4;
          }
          ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar67 + lVar47);
          piVar49 = (pointer)((long)piVar49 + lVar67 + lVar47);
          ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar67 + lVar47);
          piVar48 = (pointer)((long)piVar48 + lVar67 + lVar47);
          pvVar39 = (void *)((long)pvVar39 + lVar67 + lVar53 * 4);
          pvVar66 = (void *)((long)pvVar66 + lVar67 + lVar53 * 4);
        }
        for (; (int)uVar45 < iVar46; uVar45 = uVar45 + 1) {
          lVar67 = 0;
          for (iVar55 = iVar33; 0 < iVar55; iVar55 = iVar55 + -1) {
            auVar89._8_8_ = 0;
            auVar89._0_8_ = *(ulong *)((long)ppp_Var43 + lVar67 + 4);
            auVar90 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var43 + lVar67)),auVar89);
            auVar90 = vshufps_avx(auVar90,auVar89,0xd8);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)piVar49 + lVar67)),0x30);
            auVar116._16_8_ = *(undefined8 *)((long)piVar49 + lVar67 + 4);
            auVar116._0_16_ = auVar90;
            auVar116._24_8_ = 0;
            auVar115._16_8_ = *(undefined8 *)((long)ppp_Var41 + lVar67);
            auVar115._0_16_ = auVar90;
            auVar115._24_8_ = 0;
            auVar134 = vshufpd_avx(auVar116,auVar115,2);
            pfVar70 = (float *)((long)pvVar14 + lVar56);
            auVar76._0_4_ = auVar134._0_4_ * *pfVar70;
            auVar76._4_4_ = auVar134._4_4_ * pfVar70[1];
            auVar76._8_4_ = auVar134._8_4_ * pfVar70[2];
            auVar76._12_4_ = auVar134._12_4_ * pfVar70[3];
            auVar114._16_4_ = auVar134._16_4_ * pfVar70[4];
            auVar114._0_16_ = auVar76;
            auVar114._20_4_ = auVar134._20_4_ * pfVar70[5];
            auVar114._24_4_ = auVar134._24_4_ * pfVar70[6];
            auVar114._28_4_ = auVar134._28_4_;
            auVar90 = vhaddps_avx(auVar114._16_16_,auVar76);
            auVar90 = vhaddps_avx(auVar90,auVar90);
            auVar90 = vhaddps_avx(auVar90,auVar90);
            auVar90 = vfmadd231ss_fma(auVar90,ZEXT416(*(uint *)((long)pvVar14 + lVar56 + 0x20)),
                                      ZEXT416(*(uint *)((long)(ppp_Var41 + 1) + lVar67)));
            *(float *)((long)pvVar39 + lVar67) = auVar90._0_4_ + fVar131;
            lVar67 = lVar67 + 4;
          }
          ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 1) + lVar67);
          piVar49 = (pointer)((long)piVar49 + lVar67 + 8);
          ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 1) + lVar67);
          pvVar39 = (void *)((long)pvVar39 + lVar67);
        }
      }
    }
    else {
      if ((iVar12 != 2 || iVar46 != 2) || (uVar68 & 0xf) != 0) goto LAB_003a2751;
      iVar33 = top_blob->w;
      pvVar69 = (this->super_ConvolutionDepthWise).bias_data.data;
      pvVar14 = (this->weight_data_tm).data;
      sVar15 = top_blob->elemsize;
      uVar68 = 0;
      iVar46 = top_blob->h;
      if (top_blob->h < 1) {
        iVar46 = 0;
      }
      uVar64 = (ulong)(uint)local_228.c;
      if (local_228.c < 1) {
        uVar64 = uVar68;
      }
      lVar53 = (long)((local_228.w - iVar33) * 2) * 4;
      for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
        if (pvVar69 == (void *)0x0) {
          fVar131 = 0.0;
        }
        else {
          fVar131 = *(float *)((long)pvVar69 + uVar68 * 4);
        }
        pfVar70 = (float *)(sVar13 * sVar15 * uVar68 + (long)pvVar63);
        ppp_Var43 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.elemsize * local_228.cstep * uVar68);
        piVar49 = (pointer)((long)ppp_Var43 + (long)local_228.w * 4);
        ppp_Var41 = ppp_Var43 + local_228.w;
        for (iVar55 = 0; iVar55 != iVar46; iVar55 = iVar55 + 1) {
          lVar58 = 0;
          for (iVar50 = iVar33; 0 < iVar50; iVar50 = iVar50 + -1) {
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)((long)ppp_Var43 + lVar58 + 4);
            auVar90 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var43 + lVar58)),auVar81);
            auVar90 = vshufps_avx(auVar90,auVar81,0xd8);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)piVar49 + lVar58)),0x30);
            auVar136._16_8_ = *(undefined8 *)((long)piVar49 + lVar58 + 4);
            auVar136._0_16_ = auVar90;
            auVar136._24_8_ = 0;
            auVar134._16_8_ = *(undefined8 *)((long)ppp_Var41 + lVar58);
            auVar134._0_16_ = auVar90;
            auVar134._24_8_ = 0;
            auVar134 = vshufpd_avx(auVar136,auVar134,2);
            pfVar1 = (float *)((long)pvVar14 + uVar68 * 0x24);
            auVar82._0_4_ = auVar134._0_4_ * *pfVar1;
            auVar82._4_4_ = auVar134._4_4_ * pfVar1[1];
            auVar82._8_4_ = auVar134._8_4_ * pfVar1[2];
            auVar82._12_4_ = auVar134._12_4_ * pfVar1[3];
            auVar111._16_4_ = auVar134._16_4_ * pfVar1[4];
            auVar111._0_16_ = auVar82;
            auVar111._20_4_ = auVar134._20_4_ * pfVar1[5];
            auVar111._24_4_ = auVar134._24_4_ * pfVar1[6];
            auVar111._28_4_ = auVar134._28_4_;
            auVar90 = vhaddps_avx(auVar111._16_16_,auVar82);
            auVar90 = vhaddps_avx(auVar90,auVar90);
            auVar90 = vhaddps_avx(auVar90,auVar90);
            auVar90 = vfmadd231ss_fma(auVar90,ZEXT416(*(uint *)((long)pvVar14 + uVar68 * 0x24 + 0x20
                                                               )),
                                      ZEXT416(*(uint *)((long)(ppp_Var41 + 1) + lVar58)));
            *pfVar70 = auVar90._0_4_ + fVar131;
            pfVar70 = pfVar70 + 1;
            lVar58 = lVar58 + 8;
          }
          ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
          piVar49 = (pointer)((long)piVar49 + lVar58 + lVar53);
          ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
        }
      }
    }
LAB_003a4190:
    pLVar17 = this->activation;
    if (pLVar17 != (Layer *)0x0) {
      (*pLVar17->_vptr_Layer[9])(pLVar17,top_blob,opt);
    }
  }
  else {
    if (iVar33 != 4) {
      if (iVar33 == 8) {
        iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
        iVar37 = (this->super_ConvolutionDepthWise).kernel_h;
        uVar36 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
        uVar57 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
        bVar74 = iVar37 != 3 || iVar33 != 3;
        iVar38 = (this->super_ConvolutionDepthWise).stride_w;
        iVar51 = (this->super_ConvolutionDepthWise).stride_h;
        if ((iVar51 != 1 || iVar38 != 1) || ((bVar74 || uVar36 != 0) || uVar57 != 0)) {
          if (((bVar74 || uVar36 != 0) || uVar57 != 0) || (iVar51 != 2 || iVar38 != 2)) {
            if ((iVar38 != 1 || iVar51 != 1) ||
                (((iVar37 != 5 || iVar33 != 5) || uVar36 != 0) || uVar57 != 0)) {
              if ((((iVar37 != 5 || iVar33 != 5) || uVar36 != 0) || uVar57 != 0) ||
                  (iVar38 != 2 || iVar51 != 2)) {
                uVar36 = iVar37 * iVar33;
                std::vector<int,_std::allocator<int>_>::vector
                          (&_space_ofs,(long)(int)uVar36,(allocator_type *)&opt_p);
                iVar33 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar37 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar38 = (this->super_ConvolutionDepthWise).dilation_w * iVar37;
                lVar53 = 0;
                iVar51 = 0;
                for (iVar52 = 0; iVar52 < (this->super_ConvolutionDepthWise).kernel_h;
                    iVar52 = iVar52 + 1) {
                  for (lVar58 = 0; (int)lVar58 < iVar37; lVar58 = lVar58 + 1) {
                    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)lVar53 + lVar58] = iVar51;
                    iVar51 = iVar51 + (this->super_ConvolutionDepthWise).dilation_w;
                    iVar37 = (this->super_ConvolutionDepthWise).kernel_w;
                  }
                  iVar51 = iVar51 + (iVar12 * iVar33 - iVar38);
                  lVar53 = (int)lVar53 + lVar58;
                }
                iVar33 = 0;
                uVar57 = uVar36;
                if ((int)uVar36 < 1) {
                  uVar57 = 0;
                }
                if ((int)uVar45 < 1) {
                  uVar64 = 0;
                }
                for (uVar68 = 0; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pvVar63 = (void *)(top_blob->cstep * uVar68 * top_blob->elemsize +
                                    (long)top_blob->data);
                  pvVar69 = (this->weight_data_tm).data;
                  for (iVar37 = 0; iVar37 <= iVar55; iVar37 = iVar37 + 1) {
                    for (lVar53 = 0; lVar53 <= iVar46; lVar53 = lVar53 + 1) {
                      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                        auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      else {
                        auVar133 = ZEXT3264(*(undefined1 (*) [32])
                                             ((long)(this->super_ConvolutionDepthWise).bias_data.
                                                    data + uVar68 * 0x20));
                      }
                      for (lVar58 = 0; (ulong)uVar57 * 4 != lVar58; lVar58 = lVar58 + 4) {
                        auVar90 = vfmadd231ps_fma(auVar133._0_32_,
                                                  *(undefined1 (*) [32])
                                                   ((long)&((Allocator *)
                                                           ((long)local_228.data +
                                                           (long)*(int *)((long)_space_ofs.
                                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar58)
                                                  * 4 * 8))->_vptr_Allocator +
                                                  (long)((this->super_ConvolutionDepthWise).stride_w
                                                         * (int)lVar53 * 8) * 4 +
                                                  (long)iVar37 *
                                                  (long)(this->super_ConvolutionDepthWise).stride_h
                                                  * (long)local_228.w * local_228.elemsize +
                                                  local_228.cstep * uVar68 * local_228.elemsize),
                                                  *(undefined1 (*) [32])
                                                   ((long)pvVar69 + lVar58 * 8 + (long)iVar33 * 4));
                        auVar133 = ZEXT1664(auVar90);
                      }
                      *(undefined1 (*) [32])((long)pvVar63 + lVar53 * 0x20) = auVar133._0_32_;
                    }
                    pvVar63 = (void *)((long)pvVar63 + (long)(iVar50 * 8) * 4);
                  }
                  iVar33 = iVar33 + uVar36 * 8;
                }
                pLVar17 = this->activation;
                if (pLVar17 != (Layer *)0x0) {
                  (*pLVar17->_vptr_Layer[9])(pLVar17,top_blob,opt);
                }
                goto LAB_003a4b29;
              }
              uVar45 = top_blob->w;
              pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
              uVar64 = 0;
              uVar68 = (ulong)uVar45;
              if ((int)uVar45 < 1) {
                uVar68 = uVar64;
              }
              iVar33 = top_blob->h;
              if (top_blob->h < 1) {
                iVar33 = 0;
              }
              uVar44 = (ulong)(uint)local_228.c;
              if (local_228.c < 1) {
                uVar44 = uVar64;
              }
              lVar53 = (long)(int)((local_228.w - uVar45) * 0x10) * 4;
              for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
                if (pvVar63 == (void *)0x0) {
                  auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar134 = *(undefined1 (*) [32])((long)pvVar63 + uVar64 * 0x20);
                }
                pauVar62 = (undefined1 (*) [32])
                           (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar47 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
                ppp_Var43 = (_func_int ***)
                            ((long)(_func_int ***)local_228.data +
                            local_228.cstep * uVar64 * local_228.elemsize);
                lVar58 = (long)local_228.w * local_228.elemsize;
                ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar58);
                pvVar69 = (void *)((long)ppp_Var43 + lVar58 * 2);
                pvVar39 = (void *)((long)ppp_Var43 + lVar58 * 3);
                piVar49 = (pointer)((long)ppp_Var43 + lVar58 * 4);
                for (iVar46 = 0; iVar46 != iVar33; iVar46 = iVar46 + 1) {
                  lVar58 = 0;
                  uVar72 = uVar68;
                  while (iVar55 = (int)uVar72, uVar72 = (ulong)(iVar55 - 1), iVar55 != 0) {
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar47),
                                              auVar134,*(undefined1 (*) [32])
                                                        ((long)ppp_Var43 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var43 + 0xc) + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var43 + 0x10) + lVar58));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0xa0),
                                              ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)ppp_Var41 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar58)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var41 + 0xc) + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var41 + 0x10) + lVar58));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x140)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar69 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x1e0)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar39 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar39 + lVar58 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar39 + lVar58 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar39 + lVar58 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar39 + lVar58 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x280)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)piVar49 + lVar58));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar58 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar58 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar58 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar47 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar58 + 0x80)
                                             );
                    *pauVar62 = ZEXT1632(auVar90);
                    pauVar62 = pauVar62 + 1;
                    lVar58 = lVar58 + 0x40;
                  }
                  ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
                  ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
                  pvVar69 = (void *)((long)pvVar69 + lVar58 + lVar53);
                  pvVar39 = (void *)((long)pvVar39 + lVar58 + lVar53);
                  piVar49 = (pointer)((long)piVar49 + lVar58 + lVar53);
                }
              }
            }
            else {
              uVar64 = 0;
              uVar68 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar68 = uVar64;
              }
              pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
              iVar33 = top_blob->h;
              if (top_blob->h < 1) {
                iVar33 = 0;
              }
              uVar44 = (ulong)(uint)local_228.c;
              if (local_228.c < 1) {
                uVar44 = uVar64;
              }
              for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
                if (pvVar63 == (void *)0x0) {
                  auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar134 = *(undefined1 (*) [32])((long)pvVar63 + uVar64 * 0x20);
                }
                pvVar39 = (void *)(top_blob->cstep * uVar64 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar58 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
                ppp_Var43 = (_func_int ***)
                            ((long)(_func_int ***)local_228.data +
                            local_228.cstep * uVar64 * local_228.elemsize);
                lVar53 = (long)local_228.w * local_228.elemsize;
                ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar53);
                pvVar69 = (void *)((long)ppp_Var43 + lVar53 * 2);
                pvVar66 = (void *)((long)ppp_Var43 + lVar53 * 3);
                piVar49 = (pointer)((long)ppp_Var43 + lVar53 * 4);
                for (iVar46 = 0; iVar46 != iVar33; iVar46 = iVar46 + 1) {
                  lVar53 = 0;
                  uVar72 = uVar68;
                  while (iVar55 = (int)uVar72, uVar72 = (ulong)(iVar55 - 1), iVar55 != 0) {
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58),
                                              auVar134,*(undefined1 (*) [32])
                                                        ((long)ppp_Var43 + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar53)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar53)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var43 + 0xc) + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var43 + 0x10) + lVar53));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xa0),
                                              ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)ppp_Var41 + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar53)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar53)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var41 + 0xc) + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var41 + 0x10) + lVar53));
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x140)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar69 + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar69 + lVar53 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x1e0)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar66 + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar66 + lVar53 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar66 + lVar53 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar66 + lVar53 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar66 + lVar53 + 0x80)
                                             );
                    auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x280)
                                              ,ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)piVar49 + lVar53));
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar53 + 0x20)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar53 + 0x40)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar53 + 0x60)
                                             );
                    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                              *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar49 + lVar53 + 0x80)
                                             );
                    *(undefined1 (*) [32])((long)pvVar39 + lVar53) = ZEXT1632(auVar90);
                    lVar53 = lVar53 + 0x20;
                  }
                  ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 0x10) + lVar53);
                  ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 0x10) + lVar53);
                  pvVar69 = (void *)((long)pvVar69 + lVar53 + 0x80);
                  pvVar66 = (void *)((long)pvVar66 + lVar53 + 0x80);
                  piVar49 = (pointer)((long)piVar49 + lVar53 + 0x80);
                  pvVar39 = (void *)((long)pvVar39 + lVar53);
                }
              }
            }
          }
          else {
            iVar33 = top_blob->w;
            pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
            uVar64 = 0;
            uVar68 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar68 = uVar64;
            }
            uVar44 = (ulong)(uint)local_228.c;
            if (local_228.c < 1) {
              uVar44 = uVar64;
            }
            lVar53 = (long)((local_228.w - iVar33) * 0x10) * 4;
            for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
              if (pvVar63 == (void *)0x0) {
                auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar134 = *(undefined1 (*) [32])((long)pvVar63 + uVar64 * 0x20);
              }
              pauVar62 = (undefined1 (*) [32])
                         (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
              pvVar14 = (this->weight_data_tm).data;
              lVar58 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
              ppp_Var43 = (_func_int ***)
                          ((long)(_func_int ***)local_228.data +
                          local_228.cstep * uVar64 * local_228.elemsize);
              ppp_Var41 = (_func_int ***)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize);
              pvVar69 = (void *)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize * 2);
              auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar58);
              auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x20);
              auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x40);
              auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x60);
              auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x80);
              auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xa0);
              auVar112 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xc0);
              auVar113 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0xe0);
              auVar114 = *(undefined1 (*) [32])((long)pvVar14 + lVar58 + 0x100);
              for (iVar46 = 0; iVar46 != (int)uVar68; iVar46 = iVar46 + 1) {
                lVar58 = 0;
                for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar58)
                                           );
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar58),auVar111,auVar134);
                  auVar81 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x18) + lVar58),auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x14) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x1c) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var41 + lVar58));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar58));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar58)
                                           );
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var41 + 0x14) + lVar58));
                  auVar115 = vfmadd231ps_avx512vl
                                       (ZEXT1632(auVar81),auVar103,
                                        *(undefined1 (*) [32])((long)(ppp_Var41 + 0x18) + lVar58));
                  auVar81 = vfmadd231ps_fma(auVar115,auVar137,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var41 + 0x1c) + lVar58));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar58));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar105 = vfmadd231ps_avx512vl
                                       (ZEXT1632(auVar90),auVar107,
                                        *(undefined1 (*) [32])((long)(ppp_Var41 + 0x18) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var41 + 0x20) + lVar58));
                  auVar115 = *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x40);
                  auVar116 = *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x80);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar112,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58));
                  auVar104 = *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0xc0);
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar115);
                  auVar83 = vfmadd231ps_fma(auVar105,auVar112,auVar116);
                  auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar112,auVar104);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x20));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x60));
                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0xa0));
                  auVar83 = vfmadd231ps_fma(auVar105,auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0xe0));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar114,auVar115);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar114,auVar116);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar114,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x100));
                  auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar114,auVar104);
                  *pauVar62 = ZEXT1632(auVar90);
                  pauVar62[1] = ZEXT1632(auVar81);
                  pauVar62[2] = auVar115;
                  pauVar62[3] = ZEXT1632(auVar83);
                  pauVar62 = pauVar62 + 4;
                  lVar58 = lVar58 + 0x100;
                }
                for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar58)
                                           );
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var41 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar58));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar58)
                                           );
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar115 = *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x40);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar112,auVar115);
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x20));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x60));
                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar114,auVar115);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar114,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x80));
                  *pauVar62 = ZEXT1632(auVar81);
                  pauVar62[1] = ZEXT1632(auVar90);
                  pauVar62 = pauVar62 + 2;
                  lVar58 = lVar58 + 0x80;
                }
                for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
                  auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar58),
                                            auVar111,auVar134);
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                            *(undefined1 (*) [32])((long)ppp_Var41 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,
                                            *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar112,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar113,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x20));
                  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar114,
                                            *(undefined1 (*) [32])((long)pvVar69 + lVar58 + 0x40));
                  *pauVar62 = ZEXT1632(auVar90);
                  pauVar62 = pauVar62 + 1;
                  lVar58 = lVar58 + 0x40;
                }
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
                ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
                pvVar69 = (void *)((long)pvVar69 + lVar58 + lVar53);
              }
            }
          }
        }
        else {
          iVar33 = top_blob->w;
          iVar46 = top_blob->h;
          pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
          uVar64 = 0;
          uVar68 = (ulong)(uint)local_228.c;
          if (local_228.c < 1) {
            uVar68 = uVar64;
          }
          lVar53 = (long)(iVar33 * 8) * 4;
          lVar58 = (long)(local_228.w * 8 + 0x10) * 4;
          for (; uVar64 != uVar68; uVar64 = uVar64 + 1) {
            if (pvVar63 == (void *)0x0) {
              auVar134 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              auVar134 = *(undefined1 (*) [32])((long)pvVar63 + uVar64 * 0x20);
            }
            pvVar71 = (void *)(top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data)
            ;
            lVar56 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
            pvVar14 = (this->weight_data_tm).data;
            pvVar39 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar71);
            ppp_Var43 = (_func_int ***)
                        ((long)(_func_int ***)local_228.data +
                        local_228.cstep * uVar64 * local_228.elemsize);
            lVar47 = (long)local_228.w * local_228.elemsize;
            ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar47);
            pvVar69 = (void *)((long)ppp_Var43 + lVar47 * 2);
            pvVar66 = (void *)((long)ppp_Var43 + lVar47 * 3);
            for (uVar45 = 0; (int)(uVar45 | 1) < iVar46; uVar45 = uVar45 + 2) {
              lVar47 = 0;
              for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
                auVar111 = *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47);
                auVar136 = *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar47);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56);
                auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x20);
                auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x40);
                auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x60);
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar47),auVar102,
                                          auVar134);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47));
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47),
                                          auVar102,auVar134);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar111);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar111);
                auVar90 = vfmadd213ps_fma(auVar111,auVar102,auVar134);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar136);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar136);
                auVar90 = vfmadd213ps_fma(auVar136,auVar102,auVar134);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0x10) + lVar47))
                ;
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0x10) + lVar47))
                ;
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0x14) + lVar47))
                ;
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x80);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xa0);
                auVar112 = *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47);
                auVar113 = *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47);
                auVar114 = *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar47);
                auVar115 = *(undefined1 (*) [32])((long)(ppp_Var41 + 0x10) + lVar47);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,
                                          *(undefined1 (*) [32])((long)ppp_Var41 + lVar47));
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var41 + lVar47),auVar102,
                                          auVar134);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,auVar112);
                auVar85 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar112);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar111,auVar112);
                auVar90 = vfmadd213ps_fma(auVar112,auVar102,auVar134);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,auVar113);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar113);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar113);
                auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar137,auVar113);
                auVar87 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,auVar113);
                auVar90 = vfmadd213ps_fma(auVar113,auVar102,auVar134);
                auVar81 = vfmadd213ps_fma(auVar102,auVar114,auVar134);
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar107,auVar114);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar114);
                auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar115,auVar103);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,auVar114);
                auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar111,auVar115);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar137,auVar114);
                auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar137,auVar115);
                auVar90 = vfmadd231ps_fma(auVar102,*(undefined1 (*) [32])
                                                    ((long)(ppp_Var41 + 0x14) + lVar47),auVar137);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar114);
                auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar136,auVar115);
                auVar81 = vfmadd231ps_fma(auVar103,auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0x14) + lVar47))
                ;
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xc0);
                auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xe0);
                auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x100);
                auVar112 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x20);
                auVar113 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x40);
                auVar114 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x60);
                auVar115 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x80);
                auVar116 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0xa0);
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar107,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar107,auVar112);
                auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar113);
                auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar114,auVar107);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar102,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar102,auVar112);
                auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar113);
                auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar102,auVar114);
                auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar111,auVar112);
                auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,auVar113);
                auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,auVar114);
                auVar111 = vfmadd231ps_avx512vl(auVar107,auVar115,auVar111);
                auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar103,auVar112);
                auVar112 = vfmadd231ps_avx512vl(auVar108,auVar103,auVar113);
                auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar114);
                auVar108 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar115);
                auVar109 = vfmadd231ps_avx512vl(auVar110,auVar136,auVar113);
                auVar106 = vfmadd231ps_avx512vl(auVar106,auVar136,auVar114);
                auVar104 = vfmadd231ps_avx512vl(auVar104,auVar136,auVar115);
                auVar110 = vfmadd231ps_avx512vl(auVar111,auVar116,auVar136);
                auVar113 = vfmadd231ps_avx512vl(auVar107,auVar137,auVar113);
                auVar114 = vfmadd231ps_avx512vl(auVar112,auVar137,auVar114);
                auVar115 = vfmadd231ps_avx512vl(auVar105,auVar137,auVar115);
                auVar116 = vfmadd231ps_avx512vl(auVar108,auVar137,auVar116);
                auVar111 = *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x20);
                auVar136 = *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x40);
                auVar107 = *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x60);
                auVar112 = *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x80);
                auVar90 = vfmadd231ps_fma(auVar109,auVar102,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47));
                auVar81 = vfmadd231ps_fma(auVar106,auVar102,auVar111);
                auVar82 = vfmadd231ps_fma(auVar104,auVar102,auVar136);
                auVar83 = vfmadd231ps_fma(auVar110,auVar107,auVar102);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar111);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar136);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,auVar107);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar103);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,auVar136);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar107);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar112);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0xa0));
                *(undefined1 (*) [32])((long)pvVar71 + lVar47) = auVar113;
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x20) = auVar114;
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x40) = auVar115;
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x60) = auVar116;
                *(undefined1 (*) [32])((long)pvVar39 + lVar47) = ZEXT1632(auVar90);
                *(undefined1 (*) [32])((long)pvVar39 + lVar47 + 0x20) = ZEXT1632(auVar81);
                *(undefined1 (*) [32])((long)pvVar39 + lVar47 + 0x40) = ZEXT1632(auVar82);
                *(undefined1 (*) [32])((long)pvVar39 + lVar47 + 0x60) = ZEXT1632(auVar83);
                lVar47 = lVar47 + 0x80;
              }
              for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x20);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x40);
                auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x60);
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar47),auVar111,
                                          auVar134);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47));
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47),
                                          auVar111,auVar134);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar47));
                auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x80);
                auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xa0);
                auVar112 = *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47);
                auVar113 = *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,
                                          *(undefined1 (*) [32])((long)ppp_Var41 + lVar47));
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar112);
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var41 + lVar47),auVar111,
                                          auVar134);
                auVar81 = vfmadd213ps_fma(auVar111,auVar112,auVar134);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar112);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar137,auVar113);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar112);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar136);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,auVar113);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar113);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar47));
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xc0);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xe0);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x100);
                auVar112 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x20);
                auVar113 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x40);
                auVar114 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x60);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,auVar112);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,auVar103);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar112);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar136,auVar113);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,auVar112);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar137);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,auVar113);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar114);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar113);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,auVar114);
                auVar103 = *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x20);
                auVar137 = *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x40);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar111);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar103);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar136);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar137);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x60));
                *(undefined1 (*) [32])((long)pvVar71 + lVar47) = ZEXT1632(auVar82);
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x20) = ZEXT1632(auVar83);
                *(undefined1 (*) [32])((long)pvVar39 + lVar47) = ZEXT1632(auVar90);
                *(undefined1 (*) [32])((long)pvVar39 + lVar47 + 0x20) = ZEXT1632(auVar81);
                lVar47 = lVar47 + 0x40;
              }
              for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x20);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x40);
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar47),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56),auVar134);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47));
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x60);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47));
                auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x80);
                auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xa0);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                          *(undefined1 (*) [32])((long)ppp_Var41 + lVar47));
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var41 + lVar47),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56),auVar134);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47));
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xc0);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xe0);
                auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x100);
                auVar112 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x20);
                auVar113 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x40);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar111,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,auVar112);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar112);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,auVar113);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,auVar113);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x20));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,
                                          *(undefined1 (*) [32])((long)pvVar66 + lVar47 + 0x40));
                *(undefined1 (*) [32])((long)pvVar71 + lVar47) = ZEXT1632(auVar81);
                *(undefined1 (*) [32])((long)pvVar39 + lVar47) = ZEXT1632(auVar90);
                lVar47 = lVar47 + 0x20;
              }
              ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar47 + lVar58);
              ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar47 + lVar58);
              pvVar69 = (void *)((long)pvVar69 + lVar47 + lVar58);
              pvVar66 = (void *)((long)pvVar66 + lVar47 + lVar58);
              pvVar71 = (void *)((long)pvVar71 + lVar47 + lVar53);
              pvVar39 = (void *)((long)pvVar39 + lVar47 + lVar53);
            }
            for (; (int)uVar45 < iVar46; uVar45 = uVar45 + 1) {
              lVar47 = 0;
              for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
                auVar111 = *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47);
                auVar136 = *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar47);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56);
                auVar103 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x20);
                auVar137 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x40);
                auVar107 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x60);
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar47),auVar102,
                                          auVar134);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47));
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47),
                                          auVar102,auVar134);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar111);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar111);
                auVar90 = vfmadd213ps_fma(auVar111,auVar102,auVar134);
                auVar81 = vfmadd213ps_fma(auVar102,auVar136,auVar134);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar103,auVar136);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0x10) + lVar47),
                                          auVar103);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar137,auVar136);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0x14) + lVar47))
                ;
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0x10) + lVar47))
                ;
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x80);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xa0);
                auVar102 = *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47);
                auVar103 = *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar47);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,
                                          *(undefined1 (*) [32])((long)ppp_Var41 + lVar47));
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar107,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar102);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar107);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47));
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar102);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,auVar103);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0x10) + lVar47),
                                          auVar111);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar136,auVar102);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar103);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0x14) + lVar47))
                ;
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0x10) + lVar47))
                ;
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xc0);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xe0);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x100);
                auVar103 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x20);
                auVar137 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x40);
                auVar107 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x60);
                auVar112 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x80);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar103);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,auVar137);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar107,auVar111);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar136,auVar103);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar136,auVar137);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar107);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar112,auVar136);
                auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar137);
                auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,auVar107);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar112);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0xa0));
                *(undefined1 (*) [32])((long)pvVar71 + lVar47) = ZEXT1632(auVar83);
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x20) = ZEXT1632(auVar82);
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x40) = ZEXT1632(auVar90);
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x60) = ZEXT1632(auVar81);
                lVar47 = lVar47 + 0x80;
              }
              for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x20);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x40);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x60);
                auVar90 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var43 + lVar47),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56),auVar134);
                auVar81 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar56),
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47),
                                          auVar134);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47),
                                          auVar111);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 0xc) + lVar47));
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x80);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xa0);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,
                                          *(undefined1 (*) [32])((long)ppp_Var41 + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47),
                                          auVar102);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47),
                                          auVar111);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar136,
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 0xc) + lVar47));
                auVar111 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xc0);
                auVar136 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xe0);
                auVar102 = *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x100);
                auVar103 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x20);
                auVar137 = *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x40);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar103,auVar111);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar136,auVar103);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar137,auVar136);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,auVar137);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x60));
                *(undefined1 (*) [32])((long)pvVar71 + lVar47) = ZEXT1632(auVar90);
                *(undefined1 (*) [32])((long)pvVar71 + lVar47 + 0x20) = ZEXT1632(auVar81);
                lVar47 = lVar47 + 0x40;
              }
              for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
                auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar56),auVar134,
                                          *(undefined1 (*) [32])((long)ppp_Var43 + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x20),
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 4) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x40),
                                          *(undefined1 (*) [32])((long)(ppp_Var43 + 8) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x60),
                                          *(undefined1 (*) [32])((long)ppp_Var41 + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x80),
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 4) + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xa0),
                                          *(undefined1 (*) [32])((long)(ppp_Var41 + 8) + lVar47));
                auVar90 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xc0),
                                          ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0xe0),
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x20));
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),
                                          *(undefined1 (*) [32])((long)pvVar14 + lVar56 + 0x100),
                                          *(undefined1 (*) [32])((long)pvVar69 + lVar47 + 0x40));
                *(undefined1 (*) [32])((long)pvVar71 + lVar47) = ZEXT1632(auVar90);
                lVar47 = lVar47 + 0x20;
              }
              ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 8) + lVar47);
              ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 8) + lVar47);
              pvVar69 = (void *)((long)pvVar69 + lVar47 + 0x40);
              pvVar71 = (void *)((long)pvVar71 + lVar47);
            }
          }
        }
      }
      else {
        if (iVar33 != 0x10) goto LAB_003a2751;
        iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
        iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
        uVar36 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
        uVar57 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
        bVar74 = iVar50 != 3 || iVar33 != 3;
        iVar37 = (this->super_ConvolutionDepthWise).stride_w;
        iVar38 = (this->super_ConvolutionDepthWise).stride_h;
        if ((iVar38 != 1 || iVar37 != 1) || ((bVar74 || uVar36 != 0) || uVar57 != 0)) {
          if (((bVar74 || uVar36 != 0) || uVar57 != 0) || (iVar38 != 2 || iVar37 != 2)) {
            if ((iVar37 != 1 || iVar38 != 1) ||
                (((iVar50 != 5 || iVar33 != 5) || uVar36 != 0) || uVar57 != 0)) {
              if ((((iVar50 != 5 || iVar33 != 5) || uVar36 != 0) || uVar57 != 0) ||
                  (iVar37 != 2 || iVar38 != 2)) {
                uVar36 = iVar50 * iVar33;
                std::vector<int,_std::allocator<int>_>::vector
                          (&_space_ofs,(long)(int)uVar36,(allocator_type *)&opt_p);
                iVar33 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar37 = (this->super_ConvolutionDepthWise).dilation_w * iVar50;
                iVar51 = 0;
                lVar53 = 0;
                for (iVar38 = 0; iVar38 < (this->super_ConvolutionDepthWise).kernel_h;
                    iVar38 = iVar38 + 1) {
                  for (lVar58 = 0; (int)lVar58 < iVar50; lVar58 = lVar58 + 1) {
                    _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)lVar53 + lVar58] = iVar51;
                    iVar51 = iVar51 + (this->super_ConvolutionDepthWise).dilation_w;
                    iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
                  }
                  iVar51 = iVar51 + (iVar12 * iVar33 - iVar37);
                  lVar53 = (int)lVar53 + lVar58;
                }
                iVar33 = 0;
                uVar57 = uVar36;
                if ((int)uVar36 < 1) {
                  uVar57 = 0;
                }
                if ((int)uVar45 < 1) {
                  uVar64 = 0;
                }
                for (uVar68 = 0; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar61 = (undefined1 (*) [64])
                             (top_blob->cstep * uVar68 * top_blob->elemsize + (long)top_blob->data);
                  pvVar63 = (this->weight_data_tm).data;
                  for (iVar50 = 0; iVar50 <= iVar55; iVar50 = iVar50 + 1) {
                    for (iVar37 = 0; iVar37 <= iVar46; iVar37 = iVar37 + 1) {
                      if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                        auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      else {
                        auVar133 = *(undefined1 (*) [64])
                                    ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                    uVar68 * 0x40);
                      }
                      pauVar54 = (undefined1 (*) [64])((long)iVar33 * 4 + (long)pvVar63);
                      for (uVar44 = 0; uVar57 != uVar44; uVar44 = uVar44 + 1) {
                        auVar133 = vfmadd231ps_avx512f(auVar133,*(undefined1 (*) [64])
                                                                 ((long)&((Allocator *)
                                                                         ((long)local_228.data +
                                                                         (long)_space_ofs.
                                                                                                                                                              
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar44] *
                                                  8 * 8))->_vptr_Allocator +
                                                  (long)((this->super_ConvolutionDepthWise).stride_w
                                                         * iVar37 * 0x10) * 4 +
                                                  (long)(this->super_ConvolutionDepthWise).stride_h
                                                  * (long)iVar50 *
                                                  (long)local_228.w * local_228.elemsize +
                                                  local_228.cstep * uVar68 * local_228.elemsize),
                                                  *pauVar54);
                        pauVar54 = pauVar54 + 1;
                      }
                      *pauVar61 = auVar133;
                      pauVar61 = pauVar61 + 1;
                    }
                  }
                  iVar33 = iVar33 + uVar36 * 0x10;
                }
                pLVar17 = this->activation;
                if (pLVar17 != (Layer *)0x0) {
                  (*pLVar17->_vptr_Layer[9])(pLVar17,top_blob,opt);
                }
                goto LAB_003a4b29;
              }
              uVar45 = top_blob->w;
              pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
              uVar64 = 0;
              uVar68 = (ulong)uVar45;
              if ((int)uVar45 < 1) {
                uVar68 = uVar64;
              }
              uVar44 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar44 = uVar64;
              }
              uVar72 = (ulong)(uint)local_228.c;
              if (local_228.c < 1) {
                uVar72 = uVar64;
              }
              lVar53 = (long)(int)((local_228.w - uVar45) * 0x20) * 4;
              for (; uVar64 != uVar72; uVar64 = uVar64 + 1) {
                if (pvVar63 == (void *)0x0) {
                  auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar133 = *(undefined1 (*) [64])((long)pvVar63 + uVar64 * 0x40);
                }
                pauVar61 = (undefined1 (*) [64])
                           (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar47 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
                ppp_Var43 = (_func_int ***)
                            ((long)(_func_int ***)local_228.data +
                            local_228.cstep * uVar64 * local_228.elemsize);
                lVar58 = (long)local_228.w * local_228.elemsize;
                ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar58);
                pvVar69 = (void *)((long)ppp_Var43 + lVar58 * 2);
                pvVar39 = (void *)((long)ppp_Var43 + lVar58 * 3);
                piVar49 = (pointer)((long)ppp_Var43 + lVar58 * 4);
                for (iVar33 = 0; iVar33 != (int)uVar44; iVar33 = iVar33 + 1) {
                  lVar58 = 0;
                  uVar34 = uVar68;
                  while (iVar46 = (int)uVar34, uVar34 = (ulong)(iVar46 - 1), iVar46 != 0) {
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar14 + lVar47),
                                                   auVar133,*(undefined1 (*) [64])
                                                             ((long)ppp_Var43 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x40),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 8) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x80),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x10) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0xc0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x18) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x100),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x20) + lVar58));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar47 + 0x140),auVar130,
                                                   *(undefined1 (*) [64])((long)ppp_Var41 + lVar58))
                    ;
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x180),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 8) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x1c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 0x10) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x200),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 0x18) + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x240),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 0x20) + lVar58));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar47 + 0x280),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar69 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x2c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar58 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x300),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar58 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x340),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar58 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x380),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar58 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar47 + 0x3c0),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar39 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x400),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar39 + lVar58 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x440),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar39 + lVar58 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x480),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar39 + lVar58 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x4c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar39 + lVar58 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar47 + 0x500),auVar130,
                                                   *(undefined1 (*) [64])((long)piVar49 + lVar58));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x540),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar58 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x580),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar58 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x5c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar58 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar47 + 0x600),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar58 + 0x100));
                    *pauVar61 = auVar130;
                    pauVar61 = pauVar61 + 1;
                    lVar58 = lVar58 + 0x80;
                  }
                  ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
                  ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
                  pvVar69 = (void *)((long)pvVar69 + lVar58 + lVar53);
                  pvVar39 = (void *)((long)pvVar39 + lVar58 + lVar53);
                  piVar49 = (pointer)((long)piVar49 + lVar58 + lVar53);
                }
              }
            }
            else {
              uVar64 = 0;
              uVar68 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar68 = uVar64;
              }
              pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
              iVar33 = top_blob->h;
              if (top_blob->h < 1) {
                iVar33 = 0;
              }
              uVar44 = (ulong)(uint)local_228.c;
              if (local_228.c < 1) {
                uVar44 = uVar64;
              }
              for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
                if (pvVar63 == (void *)0x0) {
                  auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar133 = *(undefined1 (*) [64])((long)pvVar63 + uVar64 * 0x40);
                }
                pvVar39 = (void *)(top_blob->cstep * uVar64 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar14 = (this->weight_data_tm).data;
                lVar58 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
                ppp_Var43 = (_func_int ***)
                            ((long)(_func_int ***)local_228.data +
                            local_228.cstep * uVar64 * local_228.elemsize);
                lVar53 = (long)local_228.w * local_228.elemsize;
                ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar53);
                pvVar69 = (void *)((long)ppp_Var43 + lVar53 * 2);
                pvVar66 = (void *)((long)ppp_Var43 + lVar53 * 3);
                piVar49 = (pointer)((long)ppp_Var43 + lVar53 * 4);
                for (iVar46 = 0; iVar46 != iVar33; iVar46 = iVar46 + 1) {
                  lVar53 = 0;
                  uVar72 = uVar68;
                  while (iVar55 = (int)uVar72, uVar72 = (ulong)(iVar55 - 1), iVar55 != 0) {
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])((long)pvVar14 + lVar58),
                                                   auVar133,*(undefined1 (*) [64])
                                                             ((long)ppp_Var43 + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x40),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 8) + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x80),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x10) + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0xc0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x18) + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x100),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var43 + 0x20) + lVar53));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x140),auVar130,
                                                   *(undefined1 (*) [64])((long)ppp_Var41 + lVar53))
                    ;
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x180),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 8) + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x1c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 0x10) + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x200),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 0x18) + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x240),
                                                   *(undefined1 (*) [64])
                                                    ((long)(ppp_Var41 + 0x20) + lVar53));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x280),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar69 + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x2c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar53 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x300),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar53 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x340),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar53 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x380),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar69 + lVar53 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x3c0),auVar130,
                                                   *(undefined1 (*) [64])((long)pvVar66 + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x400),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar66 + lVar53 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x440),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar66 + lVar53 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x480),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar66 + lVar53 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x4c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)pvVar66 + lVar53 + 0x100));
                    auVar130 = vfmadd132ps_avx512f(*(undefined1 (*) [64])
                                                    ((long)pvVar14 + lVar58 + 0x500),auVar130,
                                                   *(undefined1 (*) [64])((long)piVar49 + lVar53));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x540),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar53 + 0x40));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x580),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar53 + 0x80));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x5c0),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar53 + 0xc0));
                    auVar130 = vfmadd231ps_avx512f(auVar130,*(undefined1 (*) [64])
                                                             ((long)pvVar14 + lVar58 + 0x600),
                                                   *(undefined1 (*) [64])
                                                    ((long)piVar49 + lVar53 + 0x100));
                    *(undefined1 (*) [64])((long)pvVar39 + lVar53) = auVar130;
                    lVar53 = lVar53 + 0x40;
                  }
                  ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 0x20) + lVar53);
                  ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 0x20) + lVar53);
                  pvVar69 = (void *)((long)pvVar69 + lVar53 + 0x100);
                  pvVar66 = (void *)((long)pvVar66 + lVar53 + 0x100);
                  piVar49 = (pointer)((long)piVar49 + lVar53 + 0x100);
                  pvVar39 = (void *)((long)pvVar39 + lVar53);
                }
              }
            }
          }
          else {
            iVar33 = top_blob->w;
            pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
            uVar64 = 0;
            uVar68 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar68 = uVar64;
            }
            uVar44 = (ulong)(uint)local_228.c;
            if (local_228.c < 1) {
              uVar44 = uVar64;
            }
            lVar53 = (long)((local_228.w - iVar33) * 0x20) * 4;
            for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
              if (pvVar63 == (void *)0x0) {
                auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar133 = *(undefined1 (*) [64])((long)pvVar63 + uVar64 * 0x40);
              }
              pauVar61 = (undefined1 (*) [64])
                         (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
              pvVar14 = (this->weight_data_tm).data;
              lVar58 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
              ppp_Var43 = (_func_int ***)
                          ((long)(_func_int ***)local_228.data +
                          local_228.cstep * uVar64 * local_228.elemsize);
              ppp_Var41 = (_func_int ***)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize);
              pvVar69 = (void *)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize * 2);
              auVar130 = *(undefined1 (*) [64])((long)pvVar14 + lVar58);
              auVar3 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x40);
              auVar4 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x80);
              auVar5 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0xc0);
              auVar6 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x100);
              auVar7 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x140);
              auVar8 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x180);
              auVar9 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x1c0);
              auVar10 = *(undefined1 (*) [64])((long)pvVar14 + lVar58 + 0x200);
              for (iVar46 = 0; iVar46 != (int)uVar68; iVar46 = iVar46 + 1) {
                lVar58 = 0;
                for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar58),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58),auVar130,
                                                 auVar133);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar117 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar58),auVar130,
                                                 auVar133);
                  auVar118 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x30) + lVar58),auVar130,
                                                 auVar133);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x28) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x38) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x30) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x40) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var41 + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x20) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 8) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x18) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x28) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x30) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x38) + lVar58));
                  auVar119 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar121 = vfmadd231ps_avx512f(auVar122,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x20) + lVar58));
                  auVar123 = vfmadd231ps_avx512f(auVar117,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x30) + lVar58));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x40) + lVar58));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar58 + 0x80);
                  auVar122 = *(undefined1 (*) [64])((long)pvVar69 + lVar58 + 0x100);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar69 + lVar58));
                  auVar117 = *(undefined1 (*) [64])((long)pvVar69 + lVar58 + 0x180);
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,auVar120);
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar8,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar8,auVar117);
                  auVar119 = vfmadd231ps_avx512f(auVar119,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x40));
                  auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0xc0));
                  auVar123 = vfmadd231ps_avx512f(auVar123,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x140));
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x1c0));
                  auVar120 = vfmadd231ps_avx512f(auVar119,auVar10,auVar120);
                  auVar122 = vfmadd231ps_avx512f(auVar121,auVar10,auVar122);
                  auVar118 = vfmadd231ps_avx512f(auVar118,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x200));
                  auVar117 = vfmadd231ps_avx512f(auVar123,auVar10,auVar117);
                  *pauVar61 = auVar120;
                  pauVar61[1] = auVar122;
                  pauVar61[2] = auVar117;
                  pauVar61[3] = auVar118;
                  pauVar61 = pauVar61 + 4;
                  lVar58 = lVar58 + 0x200;
                }
                for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar58),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58),auVar130,
                                                 auVar133);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x18) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x20) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var41 + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar5,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 8) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x18) + lVar58));
                  auVar117 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x20) + lVar58));
                  auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar58 + 0x80);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar69 + lVar58));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar8,auVar120);
                  auVar117 = vfmadd231ps_avx512f(auVar117,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x40));
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0xc0));
                  auVar120 = vfmadd231ps_avx512f(auVar117,auVar10,auVar120);
                  auVar122 = vfmadd231ps_avx512f(auVar122,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x100));
                  *pauVar61 = auVar120;
                  pauVar61[1] = auVar122;
                  pauVar61 = pauVar61 + 2;
                  lVar58 = lVar58 + 0x100;
                }
                for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
                  auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar58),
                                                 auVar130,auVar133);
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var43 + 0x10) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                                 *(undefined1 (*) [64])((long)ppp_Var41 + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 8) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar7,
                                                 *(undefined1 (*) [64])
                                                  ((long)(ppp_Var41 + 0x10) + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar8,
                                                 *(undefined1 (*) [64])((long)pvVar69 + lVar58));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar9,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x40));
                  auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,
                                                 *(undefined1 (*) [64])
                                                  ((long)pvVar69 + lVar58 + 0x80));
                  *pauVar61 = auVar120;
                  pauVar61 = pauVar61 + 1;
                  lVar58 = lVar58 + 0x80;
                }
                ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
                ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
                pvVar69 = (void *)((long)pvVar69 + lVar58 + lVar53);
              }
            }
          }
        }
        else {
          iVar33 = top_blob->w;
          iVar46 = top_blob->h;
          pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
          uVar64 = 0;
          uVar68 = (ulong)(uint)local_228.c;
          if (local_228.c < 1) {
            uVar68 = uVar64;
          }
          lVar53 = (long)(local_228.w * 0x10 + 0x20) * 4;
          lVar58 = (long)(iVar33 << 4) * 4;
          for (; uVar64 != uVar68; uVar64 = uVar64 + 1) {
            if (pvVar63 == (void *)0x0) {
              auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar133 = *(undefined1 (*) [64])((long)pvVar63 + uVar64 * 0x40);
            }
            pvVar66 = (void *)(top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data)
            ;
            pvVar14 = (this->weight_data_tm).data;
            lVar56 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
            pvVar71 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar66);
            ppp_Var43 = (_func_int ***)
                        ((long)(_func_int ***)local_228.data +
                        local_228.cstep * uVar64 * local_228.elemsize);
            lVar47 = (long)local_228.w * local_228.elemsize;
            ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar47);
            pvVar69 = (void *)((long)ppp_Var43 + lVar47 * 2);
            pvVar39 = (void *)((long)ppp_Var43 + lVar47 * 3);
            auVar130 = *(undefined1 (*) [64])((long)pvVar14 + lVar56);
            auVar3 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x40);
            auVar4 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x80);
            auVar5 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0xc0);
            auVar6 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x100);
            auVar7 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x140);
            auVar8 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x180);
            auVar9 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x1c0);
            auVar10 = *(undefined1 (*) [64])((long)pvVar14 + lVar56 + 0x200);
            for (uVar45 = 0; (int)(uVar45 | 1) < iVar46; uVar45 = uVar45 + 2) {
              lVar47 = 0;
              for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
                auVar120 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x10) + lVar47);
                auVar122 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x18) + lVar47);
                auVar117 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar47),
                                               auVar130,auVar133);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47));
                auVar118 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47),auVar130,auVar133);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar3,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar117,auVar4,auVar120);
                auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar118,auVar4,auVar122);
                auVar122 = vfmadd213ps_avx512f(auVar122,auVar130,auVar133);
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x20) + lVar47));
                auVar123 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x20) + lVar47));
                auVar124 = vfmadd231ps_avx512f(auVar122,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x28) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)(ppp_Var41 + 8) + lVar47);
                auVar122 = *(undefined1 (*) [64])((long)(ppp_Var41 + 0x10) + lVar47);
                auVar117 = *(undefined1 (*) [64])((long)(ppp_Var41 + 0x18) + lVar47);
                auVar118 = *(undefined1 (*) [64])((long)(ppp_Var41 + 0x20) + lVar47);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar5,
                                               *(undefined1 (*) [64])((long)ppp_Var41 + lVar47));
                auVar125 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var41 + lVar47),
                                               auVar130,auVar133);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar5,auVar120);
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar3,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar6,auVar120);
                auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar5,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar6,auVar122);
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar4,auVar122);
                auVar126 = vfmadd231ps_avx512f(auVar119,auVar7,auVar122);
                auVar122 = vfmadd213ps_avx512f(auVar122,auVar130,auVar133);
                auVar119 = vfmadd231ps_avx512f(auVar124,auVar5,auVar117);
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,auVar117);
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar6,auVar117);
                auVar124 = vfmadd231ps_avx512f(auVar120,auVar4,auVar117);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar7,auVar117);
                auVar120 = vfmadd213ps_avx512f(auVar117,auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar118);
                auVar117 = vfmadd231ps_avx512f(auVar119,auVar6,auVar118);
                auVar127 = vfmadd231ps_avx512f(auVar122,auVar4,auVar118);
                auVar128 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x28) + lVar47));
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar7,auVar118);
                auVar129 = vfmadd231ps_avx512f(auVar117,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x28) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x80);
                auVar117 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0xc0);
                auVar118 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x100);
                auVar119 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x140);
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar5,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar5,auVar120);
                auVar127 = vfmadd231ps_avx512f(auVar127,auVar5,auVar122);
                auVar128 = vfmadd231ps_avx512f(auVar128,auVar5,auVar117);
                auVar126 = vfmadd231ps_avx512f(auVar126,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,auVar120);
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar8,auVar122);
                auVar129 = vfmadd231ps_avx512f(auVar129,auVar8,auVar117);
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar6,auVar120);
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar6,auVar122);
                auVar127 = vfmadd231ps_avx512f(auVar127,auVar6,auVar117);
                auVar128 = vfmadd231ps_avx512f(auVar128,auVar6,auVar118);
                auVar120 = vfmadd231ps_avx512f(auVar126,auVar9,auVar120);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,auVar122);
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar9,auVar117);
                auVar126 = vfmadd231ps_avx512f(auVar129,auVar9,auVar118);
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar7,auVar122);
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar7,auVar117);
                auVar127 = vfmadd231ps_avx512f(auVar127,auVar7,auVar118);
                auVar128 = vfmadd231ps_avx512f(auVar128,auVar7,auVar119);
                auVar129 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar10,auVar117);
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar10,auVar118);
                auVar119 = vfmadd231ps_avx512f(auVar126,auVar10,auVar119);
                auVar120 = *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x80);
                auVar117 = *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0xc0);
                auVar118 = *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x100);
                auVar125 = vfmadd231ps_avx512f(auVar125,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar39 + lVar47));
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar8,auVar120);
                auVar126 = vfmadd231ps_avx512f(auVar127,auVar8,auVar122);
                auVar127 = vfmadd231ps_avx512f(auVar128,auVar8,auVar117);
                auVar120 = vfmadd231ps_avx512f(auVar125,auVar9,auVar120);
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar9,auVar122);
                auVar125 = vfmadd231ps_avx512f(auVar126,auVar9,auVar117);
                auVar126 = vfmadd231ps_avx512f(auVar127,auVar9,auVar118);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                auVar122 = vfmadd231ps_avx512f(auVar124,auVar10,auVar117);
                auVar117 = vfmadd231ps_avx512f(auVar125,auVar10,auVar118);
                auVar118 = vfmadd231ps_avx512f(auVar126,auVar10,
                                               *(undefined1 (*) [64])
                                                ((long)pvVar39 + lVar47 + 0x140));
                *(undefined1 (*) [64])((long)pvVar66 + lVar47) = auVar129;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0x40) = auVar121;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0x80) = auVar123;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0xc0) = auVar119;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47) = auVar120;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47 + 0x40) = auVar122;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47 + 0x80) = auVar117;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47 + 0xc0) = auVar118;
                lVar47 = lVar47 + 0x100;
              }
              for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
                auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar47),
                                               auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47));
                auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47),auVar130,auVar133);
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x10) + lVar47));
                auVar117 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x10) + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar122,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x18) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)(ppp_Var41 + 8) + lVar47);
                auVar122 = *(undefined1 (*) [64])((long)(ppp_Var41 + 0x10) + lVar47);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar5,
                                               *(undefined1 (*) [64])((long)ppp_Var41 + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,auVar120);
                auVar119 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var41 + lVar47),
                                               auVar130,auVar133);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar6,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar3,auVar120);
                auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar6,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar117,auVar7,auVar122);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x18) + lVar47));
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar4,auVar122);
                auVar123 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x18) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x80);
                auVar117 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0xc0);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar8,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar5,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar5,auVar120);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,auVar120);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar9,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar119,auVar6,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar123,auVar6,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar10,auVar122);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar10,auVar117);
                auVar123 = vfmadd231ps_avx512f(auVar120,auVar7,auVar122);
                auVar117 = vfmadd231ps_avx512f(auVar119,auVar7,auVar117);
                auVar120 = *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x80);
                auVar119 = vfmadd231ps_avx512f(auVar123,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar39 + lVar47));
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,auVar120);
                auVar120 = vfmadd231ps_avx512f(auVar119,auVar9,auVar120);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar9,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                auVar122 = vfmadd231ps_avx512f(auVar117,auVar10,
                                               *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0xc0)
                                              );
                *(undefined1 (*) [64])((long)pvVar66 + lVar47) = auVar121;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0x40) = auVar118;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47) = auVar120;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47 + 0x40) = auVar122;
                lVar47 = lVar47 + 0x80;
              }
              for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
                auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar47),
                                               auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x10) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                               *(undefined1 (*) [64])((long)ppp_Var41 + lVar47));
                auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var41 + lVar47),
                                               auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar117 = vfmadd231ps_avx512f(auVar120,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x10) + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar122,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x10) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x80);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar9,auVar120);
                auVar120 = vfmadd231ps_avx512f(auVar118,auVar6,auVar120);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar10,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar7,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar39 + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar9,
                                               *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x40)
                                              );
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,
                                               *(undefined1 (*) [64])((long)pvVar39 + lVar47 + 0x80)
                                              );
                *(undefined1 (*) [64])((long)pvVar66 + lVar47) = auVar117;
                *(undefined1 (*) [64])((long)pvVar71 + lVar47) = auVar120;
                lVar47 = lVar47 + 0x40;
              }
              ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar47 + lVar53);
              ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar47 + lVar53);
              pvVar69 = (void *)((long)pvVar69 + lVar47 + lVar53);
              pvVar39 = (void *)((long)pvVar39 + lVar47 + lVar53);
              pvVar66 = (void *)((long)pvVar66 + lVar47 + lVar58);
              pvVar71 = (void *)((long)pvVar71 + lVar47 + lVar58);
            }
            for (; (int)uVar45 < iVar46; uVar45 = uVar45 + 1) {
              lVar47 = 0;
              for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
                auVar120 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x10) + lVar47);
                auVar122 = *(undefined1 (*) [64])((long)(ppp_Var43 + 0x18) + lVar47);
                auVar117 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar47),
                                               auVar130,auVar133);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47));
                auVar118 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47),auVar130,auVar133);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar3,auVar120);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar4,auVar120);
                auVar120 = vfmadd213ps_avx512f(auVar120,auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,auVar122);
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar4,auVar122);
                auVar122 = vfmadd213ps_avx512f(auVar122,auVar130,auVar133);
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x20) + lVar47));
                auVar119 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x20) + lVar47));
                auVar121 = vfmadd231ps_avx512f(auVar122,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x28) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)(ppp_Var41 + 0x10) + lVar47);
                auVar122 = *(undefined1 (*) [64])((long)(ppp_Var41 + 0x18) + lVar47);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar5,
                                               *(undefined1 (*) [64])((long)ppp_Var41 + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar5,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar5,auVar120);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar5,auVar122);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar6,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar6,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar6,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar6,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x20) + lVar47));
                auVar123 = vfmadd231ps_avx512f(auVar117,auVar7,auVar120);
                auVar124 = vfmadd231ps_avx512f(auVar118,auVar7,auVar122);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x20) + lVar47));
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x28) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x80);
                auVar117 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0xc0);
                auVar118 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x100);
                auVar123 = vfmadd231ps_avx512f(auVar123,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar124 = vfmadd231ps_avx512f(auVar124,auVar8,auVar120);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar8,auVar122);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar8,auVar117);
                auVar120 = vfmadd231ps_avx512f(auVar123,auVar9,auVar120);
                auVar123 = vfmadd231ps_avx512f(auVar124,auVar9,auVar122);
                auVar119 = vfmadd231ps_avx512f(auVar119,auVar9,auVar117);
                auVar121 = vfmadd231ps_avx512f(auVar121,auVar9,auVar118);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                auVar122 = vfmadd231ps_avx512f(auVar123,auVar10,auVar117);
                auVar117 = vfmadd231ps_avx512f(auVar119,auVar10,auVar118);
                auVar118 = vfmadd231ps_avx512f(auVar121,auVar10,
                                               *(undefined1 (*) [64])
                                                ((long)pvVar69 + lVar47 + 0x140));
                *(undefined1 (*) [64])((long)pvVar66 + lVar47) = auVar120;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0x40) = auVar122;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0x80) = auVar117;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0xc0) = auVar118;
                lVar47 = lVar47 + 0x100;
              }
              for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
                auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar47),
                                               auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47));
                auVar122 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47),auVar130,auVar133);
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x10) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x10) + lVar47));
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x18) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                               *(undefined1 (*) [64])((long)ppp_Var41 + lVar47));
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar5,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar122 = vfmadd231ps_avx512f(auVar122,auVar6,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x10) + lVar47));
                auVar117 = vfmadd231ps_avx512f(auVar120,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x10) + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar122,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x18) + lVar47));
                auVar120 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x40);
                auVar122 = *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x80);
                auVar117 = vfmadd231ps_avx512f(auVar117,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar118 = vfmadd231ps_avx512f(auVar118,auVar8,auVar120);
                auVar120 = vfmadd231ps_avx512f(auVar117,auVar9,auVar120);
                auVar117 = vfmadd231ps_avx512f(auVar118,auVar9,auVar122);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,auVar122);
                auVar122 = vfmadd231ps_avx512f(auVar117,auVar10,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0xc0)
                                              );
                *(undefined1 (*) [64])((long)pvVar66 + lVar47) = auVar120;
                *(undefined1 (*) [64])((long)pvVar66 + lVar47 + 0x40) = auVar122;
                lVar47 = lVar47 + 0x80;
              }
              for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
                auVar120 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)ppp_Var43 + lVar47),
                                               auVar130,auVar133);
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar3,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 8) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar4,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var43 + 0x10) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar5,
                                               *(undefined1 (*) [64])((long)ppp_Var41 + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar6,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 8) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar7,
                                               *(undefined1 (*) [64])
                                                ((long)(ppp_Var41 + 0x10) + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar8,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47));
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar9,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x40)
                                              );
                auVar120 = vfmadd231ps_avx512f(auVar120,auVar10,
                                               *(undefined1 (*) [64])((long)pvVar69 + lVar47 + 0x80)
                                              );
                *(undefined1 (*) [64])((long)pvVar66 + lVar47) = auVar120;
                lVar47 = lVar47 + 0x40;
              }
              ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 0x10) + lVar47);
              ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 0x10) + lVar47);
              pvVar69 = (void *)((long)pvVar69 + lVar47 + 0x80);
              pvVar66 = (void *)((long)pvVar66 + lVar47);
            }
          }
        }
      }
      goto LAB_003a4190;
    }
    iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar37 = (this->super_ConvolutionDepthWise).kernel_h;
    uVar36 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
    uVar57 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
    iVar38 = (this->super_ConvolutionDepthWise).stride_w;
    iVar51 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar51 == 1 && iVar38 == 1) &&
        (((iVar37 == 3 && iVar33 == 3) && uVar36 == 0) && uVar57 == 0)) {
      iVar33 = top_blob->w;
      pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar64 = 0;
      uVar68 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar68 = uVar64;
      }
      uVar45 = local_228.c;
      if (local_228.c < 1) {
        uVar45 = 0;
      }
      for (; uVar64 != uVar45; uVar64 = uVar64 + 1) {
        if (pvVar63 == (void *)0x0) {
          auVar90 = ZEXT816(0) << 0x40;
        }
        else {
          auVar90 = *(undefined1 (*) [16])((long)pvVar63 + uVar64 * 0x10);
        }
        pauVar59 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
        pvVar69 = (this->weight_data_tm).data;
        lVar53 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
        ppp_Var43 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.cstep * uVar64 * local_228.elemsize);
        auVar81 = *(undefined1 (*) [16])((long)pvVar69 + lVar53);
        auVar82 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x10);
        auVar83 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x20);
        auVar84 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x30);
        auVar85 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x40);
        auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x50);
        auVar87 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x60);
        auVar88 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x70);
        auVar89 = *(undefined1 (*) [16])((long)pvVar69 + lVar53 + 0x80);
        ppp_Var41 = (_func_int ***)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize);
        pauVar60 = (undefined1 (*) [16])
                   ((long)ppp_Var43 + (long)local_228.w * local_228.elemsize * 2);
        for (iVar46 = 0; iVar46 != (int)uVar68; iVar46 = iVar46 + 1) {
          ppp_Var73 = ppp_Var43 + 4;
          ppp_Var42 = ppp_Var41 + 4;
          pauVar40 = pauVar60 + 2;
          lVar53 = 0;
          for (iVar55 = 0; iVar55 + 7 < iVar33; iVar55 = iVar55 + 8) {
            auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var43 + lVar53),auVar81,
                                      auVar90);
            auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar53);
            auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar53);
            auVar78 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 6) + lVar53);
            auVar91 = vfmadd231ps_fma(auVar91,auVar82,auVar76);
            auVar91 = vfmadd231ps_fma(auVar91,auVar83,auVar77);
            auVar135 = vfmadd231ps_fma(auVar91,auVar84,
                                       *(undefined1 (*) [16])((long)ppp_Var41 + lVar53));
            auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 2) + lVar53);
            auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 4) + lVar53);
            auVar135 = vfmadd231ps_fma(auVar135,auVar85,auVar91);
            auVar135 = vfmadd231ps_fma(auVar135,auVar86,auVar79);
            auVar75 = vfmadd231ps_fma(auVar135,auVar87,*(undefined1 (*) [16])(*pauVar60 + lVar53));
            auVar135 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 6) + lVar53);
            auVar80 = *(undefined1 (*) [16])(pauVar60[1] + lVar53);
            auVar138 = *(undefined1 (*) [16])(pauVar60[2] + lVar53);
            auVar139 = *(undefined1 (*) [16])(pauVar60[3] + lVar53);
            auVar75 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar80);
            auVar75 = vfmadd231ps_avx512vl(auVar75,auVar89,auVar138);
            *(undefined1 (*) [16])(*pauVar59 + lVar53) = auVar75;
            auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar135);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
            auVar75 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar139);
            auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 8) + lVar53);
            auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 8) + lVar53);
            auVar80 = *(undefined1 (*) [16])(pauVar60[4] + lVar53);
            *(undefined1 (*) [16])(pauVar59[1] + lVar53) = auVar75;
            auVar77 = vfmadd213ps_fma(auVar77,auVar81,auVar90);
            auVar77 = vfmadd231ps_fma(auVar77,auVar82,auVar78);
            auVar77 = vfmadd231ps_fma(auVar77,auVar83,auVar76);
            auVar77 = vfmadd231ps_fma(auVar77,auVar84,auVar79);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar135);
            auVar77 = vfmadd231ps_fma(auVar77,auVar86,auVar91);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar138);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar139);
            auVar75 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar80);
            auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 10) + lVar53);
            auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 10) + lVar53);
            auVar138 = *(undefined1 (*) [16])(pauVar60[5] + lVar53);
            *(undefined1 (*) [16])(pauVar59[2] + lVar53) = auVar75;
            auVar78 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
            auVar78 = vfmadd231ps_fma(auVar78,auVar82,auVar76);
            auVar78 = vfmadd231ps_fma(auVar78,auVar83,auVar77);
            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar84,auVar135);
            auVar78 = vfmadd231ps_fma(auVar78,auVar85,auVar91);
            auVar78 = vfmadd231ps_fma(auVar78,auVar86,auVar79);
            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar139);
            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar80);
            auVar75 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar138);
            auVar78 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 0xc) + lVar53);
            auVar135 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 0xc) + lVar53);
            auVar139 = *(undefined1 (*) [16])(pauVar60[6] + lVar53);
            *(undefined1 (*) [16])(pauVar59[3] + lVar53) = auVar75;
            auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar135);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
            auVar75 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar139);
            auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 0xe) + lVar53);
            auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 0xe) + lVar53);
            auVar80 = *(undefined1 (*) [16])(pauVar60[7] + lVar53);
            *(undefined1 (*) [16])(pauVar59[4] + lVar53) = auVar75;
            auVar77 = vfmadd213ps_fma(auVar77,auVar81,auVar90);
            auVar77 = vfmadd231ps_fma(auVar77,auVar82,auVar78);
            auVar77 = vfmadd231ps_fma(auVar77,auVar83,auVar76);
            auVar77 = vfmadd231ps_fma(auVar77,auVar84,auVar79);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar135);
            auVar77 = vfmadd231ps_fma(auVar77,auVar86,auVar91);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar138);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar139);
            auVar75 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar80);
            auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 0x10) + lVar53);
            auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 0x10) + lVar53);
            auVar138 = *(undefined1 (*) [16])(pauVar60[8] + lVar53);
            *(undefined1 (*) [16])(pauVar59[5] + lVar53) = auVar75;
            auVar78 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
            auVar78 = vfmadd231ps_fma(auVar78,auVar82,auVar76);
            auVar78 = vfmadd231ps_fma(auVar78,auVar83,auVar77);
            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar84,auVar135);
            auVar78 = vfmadd231ps_fma(auVar78,auVar85,auVar91);
            auVar78 = vfmadd231ps_fma(auVar78,auVar86,auVar79);
            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar139);
            auVar78 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar80);
            auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var43 + 0x12) + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var41 + 0x12) + lVar53));
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
            auVar76 = vfmadd231ps_fma(auVar76,auVar89,*(undefined1 (*) [16])(pauVar60[9] + lVar53));
            auVar77 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar138);
            *(undefined1 (*) [16])(pauVar59[6] + lVar53) = auVar77;
            *(undefined1 (*) [16])(pauVar59[7] + lVar53) = auVar76;
            lVar53 = lVar53 + 0x80;
            ppp_Var73 = ppp_Var73 + 0x10;
            ppp_Var42 = ppp_Var42 + 0x10;
            pauVar40 = pauVar40 + 8;
          }
          for (; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
            auVar91 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var43 + lVar53),auVar81,
                                      auVar90);
            auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar53);
            auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar53);
            auVar78 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 6) + lVar53);
            auVar91 = vfmadd231ps_fma(auVar91,auVar82,auVar76);
            auVar91 = vfmadd231ps_fma(auVar91,auVar83,auVar77);
            auVar135 = vfmadd231ps_fma(auVar91,auVar84,
                                       *(undefined1 (*) [16])((long)ppp_Var41 + lVar53));
            auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 2) + lVar53);
            auVar79 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 4) + lVar53);
            auVar135 = vfmadd231ps_fma(auVar135,auVar85,auVar91);
            auVar135 = vfmadd231ps_fma(auVar135,auVar86,auVar79);
            auVar75 = vfmadd231ps_fma(auVar135,auVar87,*(undefined1 (*) [16])(*pauVar60 + lVar53));
            auVar135 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 6) + lVar53);
            auVar80 = *(undefined1 (*) [16])(pauVar60[1] + lVar53);
            auVar138 = *(undefined1 (*) [16])(pauVar60[2] + lVar53);
            auVar139 = *(undefined1 (*) [16])(pauVar60[3] + lVar53);
            auVar75 = vfmadd231ps_avx512vl(auVar75,auVar88,auVar80);
            auVar75 = vfmadd231ps_avx512vl(auVar75,auVar89,auVar138);
            *(undefined1 (*) [16])(*pauVar59 + lVar53) = auVar75;
            auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,auVar77);
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar91);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar79);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar135);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar80);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar138);
            auVar75 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar139);
            auVar76 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var43 + 8) + lVar53);
            auVar91 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var41 + 8) + lVar53);
            auVar80 = *(undefined1 (*) [16])(pauVar60[4] + lVar53);
            *(undefined1 (*) [16])(pauVar59[1] + lVar53) = auVar75;
            auVar77 = vfmadd213ps_fma(auVar77,auVar81,auVar90);
            auVar77 = vfmadd231ps_fma(auVar77,auVar82,auVar78);
            auVar77 = vfmadd231ps_fma(auVar77,auVar83,auVar76);
            auVar77 = vfmadd231ps_fma(auVar77,auVar84,auVar79);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar135);
            auVar77 = vfmadd231ps_fma(auVar77,auVar86,auVar91);
            auVar77 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar138);
            auVar79 = vfmadd231ps_avx512vl(auVar77,auVar88,auVar139);
            auVar77 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar77,auVar82,auVar76);
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var43 + 10) + lVar53));
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar84,auVar135);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,auVar91);
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var41 + 10) + lVar53));
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar139);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar80);
            auVar76 = vfmadd231ps_fma(auVar76,auVar89,*(undefined1 (*) [16])(pauVar60[5] + lVar53));
            auVar77 = vfmadd231ps_avx512vl(auVar79,auVar89,auVar80);
            *(undefined1 (*) [16])(pauVar59[2] + lVar53) = auVar77;
            *(undefined1 (*) [16])(pauVar59[3] + lVar53) = auVar76;
            lVar53 = lVar53 + 0x40;
            ppp_Var73 = ppp_Var73 + 8;
            ppp_Var42 = ppp_Var42 + 8;
            pauVar40 = pauVar40 + 4;
          }
          for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
            auVar76 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [16])((long)ppp_Var43 + lVar53),auVar81,auVar90);
            auVar76 = vfmadd231ps_avx512vl
                                (auVar76,auVar82,
                                 *(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar53));
            auVar76 = vfmadd231ps_avx512vl
                                (auVar76,auVar83,
                                 *(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar53));
            auVar76 = vfmadd231ps_avx512vl
                                (auVar76,auVar84,*(undefined1 (*) [16])((long)ppp_Var41 + lVar53));
            auVar76 = vfmadd231ps_avx512vl
                                (auVar76,auVar85,
                                 *(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])(ppp_Var41 + 2) + lVar53));
            auVar76 = vfmadd231ps_avx512vl
                                (auVar76,auVar86,
                                 *(undefined1 (*) [16])
                                  (*(undefined1 (*) [16])(ppp_Var41 + 4) + lVar53));
            auVar76 = vfmadd231ps_avx512vl
                                (auVar76,auVar87,*(undefined1 (*) [16])(*pauVar60 + lVar53));
            auVar77 = vfmadd231ps_avx512vl
                                (auVar76,auVar88,*(undefined1 (*) [16])(pauVar60[1] + lVar53));
            auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var43 + 2) + lVar53),auVar81,
                                      auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var43 + 4) + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var43 + 6) + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var41 + 2) + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var41 + 4) + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])(ppp_Var41 + 6) + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar87,*(undefined1 (*) [16])(pauVar60[1] + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar88,*(undefined1 (*) [16])(pauVar60[2] + lVar53));
            auVar76 = vfmadd231ps_fma(auVar76,auVar89,*(undefined1 (*) [16])(pauVar60[3] + lVar53));
            auVar77 = vfmadd231ps_avx512vl
                                (auVar77,auVar89,*(undefined1 (*) [16])(pauVar60[2] + lVar53));
            *(undefined1 (*) [16])(*pauVar59 + lVar53) = auVar77;
            *(undefined1 (*) [16])(pauVar59[1] + lVar53) = auVar76;
            lVar53 = lVar53 + 0x20;
            ppp_Var73 = ppp_Var73 + 4;
            ppp_Var42 = ppp_Var42 + 4;
            pauVar40 = pauVar40 + 2;
          }
          pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar53);
          ppp_Var43 = ppp_Var73;
          for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
            auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(ppp_Var43 + -4),auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,*(undefined1 (*) [16])(ppp_Var43 + -2));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,*(undefined1 (*) [16])ppp_Var43);
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,*(undefined1 (*) [16])(ppp_Var42 + -4));
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,*(undefined1 (*) [16])(ppp_Var42 + -2));
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,*(undefined1 (*) [16])ppp_Var42);
            auVar76 = vfmadd231ps_fma(auVar76,auVar87,pauVar40[-2]);
            auVar76 = vfmadd231ps_fma(auVar76,auVar88,pauVar40[-1]);
            auVar76 = vfmadd231ps_fma(auVar76,auVar89,*pauVar40);
            *pauVar59 = auVar76;
            pauVar59 = pauVar59 + 1;
            ppp_Var43 = ppp_Var43 + 2;
            ppp_Var42 = ppp_Var42 + 2;
            pauVar40 = pauVar40 + 1;
          }
          ppp_Var41 = ppp_Var42;
          pauVar60 = pauVar40;
        }
      }
      goto LAB_003a4190;
    }
    if ((((iVar37 == 3 && iVar33 == 3) && uVar36 == 0) && uVar57 == 0) &&
        (iVar51 == 2 && iVar38 == 2)) {
      iVar33 = top_blob->w;
      pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar64 = 0;
      uVar68 = (ulong)(uint)top_blob->h;
      if (top_blob->h < 1) {
        uVar68 = uVar64;
      }
      uVar44 = (ulong)(uint)local_228.c;
      if (local_228.c < 1) {
        uVar44 = uVar64;
      }
      lVar53 = (long)((local_228.w - iVar33) * 8) * 4;
      for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
        if (pvVar63 == (void *)0x0) {
          auVar90 = ZEXT816(0) << 0x40;
        }
        else {
          auVar90 = *(undefined1 (*) [16])((long)pvVar63 + uVar64 * 0x10);
        }
        pauVar60 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
        pvVar14 = (this->weight_data_tm).data;
        lVar58 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
        ppp_Var43 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.cstep * uVar64 * local_228.elemsize);
        ppp_Var41 = (_func_int ***)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize);
        pvVar69 = (void *)((long)ppp_Var43 + (long)local_228.w * local_228.elemsize * 2);
        auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar58);
        auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x10);
        auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x20);
        auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x30);
        auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x40);
        auVar86 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x50);
        auVar87 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x60);
        auVar88 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x70);
        auVar89 = *(undefined1 (*) [16])((long)pvVar14 + lVar58 + 0x80);
        for (iVar46 = 0; iVar46 != (int)uVar68; iVar46 = iVar46 + 1) {
          lVar58 = 0;
          for (iVar55 = 0; iVar55 + 3 < iVar33; iVar55 = iVar55 + 4) {
            auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var43 + lVar58),auVar81,
                                      auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
            auVar77 = vfmadd231ps_fma(auVar76,auVar84,
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar58));
            auVar76 = *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar58);
            auVar78 = vfmadd231ps_fma(auVar77,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar58));
            auVar77 = *(undefined1 (*) [16])((long)(ppp_Var41 + 8) + lVar58);
            auVar78 = vfmadd231ps_fma(auVar78,auVar86,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar58));
            auVar78 = vfmadd231ps_fma(auVar78,auVar87,*(undefined1 (*) [16])((long)pvVar69 + lVar58)
                                     );
            auVar79 = vfmadd231ps_fma(auVar78,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x10));
            auVar78 = *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x20);
            auVar91 = *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x40);
            auVar135 = vfmadd231ps_fma(auVar79,auVar89,auVar78);
            auVar79 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58),auVar81
                                      ,auVar90);
            auVar79 = vfmadd231ps_fma(auVar79,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar58));
            auVar79 = vfmadd231ps_fma(auVar79,auVar83,auVar76);
            auVar79 = vfmadd231ps_fma(auVar79,auVar84,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar58));
            auVar79 = vfmadd231ps_fma(auVar79,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 6) + lVar58));
            auVar79 = vfmadd231ps_fma(auVar79,auVar86,auVar77);
            auVar78 = vfmadd231ps_fma(auVar79,auVar87,auVar78);
            auVar78 = vfmadd231ps_fma(auVar78,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x30));
            *pauVar60 = auVar135;
            auVar80 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar91);
            auVar78 = *(undefined1 (*) [16])((long)(ppp_Var43 + 0xc) + lVar58);
            auVar79 = *(undefined1 (*) [16])((long)(ppp_Var41 + 0xc) + lVar58);
            auVar135 = *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x60);
            auVar76 = vfmadd213ps_fma(auVar76,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 10) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,auVar78);
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar77);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 10) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,auVar79);
            auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar91);
            auVar77 = vfmadd231ps_fma(auVar76,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x50));
            pauVar60[1] = auVar80;
            auVar76 = vfmadd213ps_fma(auVar78,auVar81,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 0xe) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 0x10) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,auVar79);
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 0xe) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 0x10) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar87,auVar135);
            auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x70));
            auVar77 = vfmadd231ps_fma(auVar77,auVar89,auVar135);
            auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x80));
            pauVar60[2] = auVar77;
            pauVar60[3] = auVar76;
            pauVar60 = pauVar60 + 4;
            lVar58 = lVar58 + 0x80;
          }
          for (; iVar55 + 1 < iVar33; iVar55 = iVar55 + 2) {
            auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var43 + lVar58),auVar81,
                                      auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar87,*(undefined1 (*) [16])((long)pvVar69 + lVar58)
                                     );
            auVar77 = vfmadd231ps_fma(auVar76,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x10));
            auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58),auVar81
                                      ,auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 6) + lVar58));
            auVar78 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 8) + lVar58));
            auVar76 = *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x20);
            auVar78 = vfmadd231ps_fma(auVar78,auVar87,auVar76);
            auVar78 = vfmadd231ps_fma(auVar78,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x30));
            auVar76 = vfmadd231ps_fma(auVar77,auVar89,auVar76);
            auVar77 = vfmadd231ps_fma(auVar78,auVar89,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x40));
            *pauVar60 = auVar76;
            pauVar60[1] = auVar77;
            pauVar60 = pauVar60 + 2;
            lVar58 = lVar58 + 0x40;
          }
          for (; iVar55 < iVar33; iVar55 = iVar55 + 1) {
            auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var43 + lVar58),auVar81,
                                      auVar90);
            auVar76 = vfmadd231ps_fma(auVar76,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar84,
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar86,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar58));
            auVar76 = vfmadd231ps_fma(auVar76,auVar87,*(undefined1 (*) [16])((long)pvVar69 + lVar58)
                                     );
            auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x10));
            auVar76 = vfmadd231ps_fma(auVar76,auVar89,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x20));
            *pauVar60 = auVar76;
            pauVar60 = pauVar60 + 1;
            lVar58 = lVar58 + 0x20;
          }
          ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
          ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
          pvVar69 = (void *)((long)pvVar69 + lVar58 + lVar53);
        }
      }
      goto LAB_003a4190;
    }
    if ((iVar38 == 1 && iVar51 == 1) &&
        (((iVar37 == 5 && iVar33 == 5) && uVar36 == 0) && uVar57 == 0)) {
      uVar45 = top_blob->w;
      iVar33 = top_blob->h;
      pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar68 = 0;
      uVar36 = uVar45;
      if ((int)uVar45 < 1) {
        uVar36 = 0;
      }
      uVar57 = local_228.c;
      if (local_228.c < 1) {
        uVar57 = 0;
      }
      lVar53 = (long)(int)(uVar45 * 4) * 4;
      lVar58 = (long)(local_228.w * 4 + 0x10) * 4;
      for (; uVar68 != uVar57; uVar68 = uVar68 + 1) {
        if (pvVar63 == (void *)0x0) {
          auVar90 = ZEXT816(0) << 0x40;
        }
        else {
          auVar90 = *(undefined1 (*) [16])((long)pvVar63 + uVar68 * 0x10);
        }
        pvVar65 = (void *)(top_blob->cstep * uVar68 * top_blob->elemsize + (long)top_blob->data);
        pvVar14 = (this->weight_data_tm).data;
        lVar56 = (long)(this->weight_data_tm).w * uVar68 * (this->weight_data_tm).elemsize;
        pvVar71 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar65);
        ppp_Var43 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.cstep * uVar68 * local_228.elemsize);
        lVar47 = (long)local_228.w * local_228.elemsize;
        ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar47);
        pvVar69 = (void *)((long)ppp_Var43 + lVar47 * 2);
        pvVar66 = (void *)((long)ppp_Var43 + lVar47 * 3);
        piVar49 = (pointer)((long)ppp_Var43 + lVar47 * 4);
        pvVar39 = (void *)((long)ppp_Var43 + lVar47 * 5);
        for (uVar45 = 0; (int)(uVar45 | 1) < iVar33; uVar45 = uVar45 + 2) {
          lVar47 = 0;
          uVar35 = uVar36;
          while (bVar74 = uVar35 != 0, uVar35 = uVar35 - 1, bVar74) {
            auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x10);
            auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x20);
            auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x30);
            auVar84 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var43 + lVar47),
                                      *(undefined1 (*) [16])((long)pvVar14 + lVar56),auVar90);
            auVar84 = vfmadd231ps_fma(auVar84,auVar81,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar47));
            auVar84 = vfmadd231ps_fma(auVar84,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar47));
            auVar85 = vfmadd231ps_fma(auVar84,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar47));
            auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x40);
            auVar86 = vfmadd231ps_fma(auVar85,auVar84,
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar47));
            auVar85 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar56),
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar47),auVar90);
            auVar81 = vfmadd231ps_fma(auVar85,*(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar47)
                                      ,auVar81);
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar47)
                                      ,auVar82);
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)(ppp_Var41 + 6) + lVar47)
                                      ,auVar83);
            auVar76 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)(ppp_Var41 + 8) + lVar47)
                                      ,auVar84);
            auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x50);
            auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x60);
            auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x70);
            auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x80);
            auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x90);
            auVar86 = vfmadd231ps_fma(auVar86,auVar81,
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar47));
            auVar86 = vfmadd231ps_fma(auVar86,auVar82,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar47));
            auVar86 = vfmadd231ps_fma(auVar86,auVar83,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar47));
            auVar86 = vfmadd231ps_fma(auVar86,auVar84,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 6) + lVar47));
            auVar77 = vfmadd231ps_fma(auVar86,auVar85,
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 8) + lVar47));
            auVar86 = *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x10);
            auVar87 = *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x20);
            auVar88 = *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x30);
            auVar89 = *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x40);
            auVar81 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)pvVar69 + lVar47),auVar81
                                     );
            auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar82);
            auVar81 = vfmadd231ps_fma(auVar81,auVar87,auVar83);
            auVar81 = vfmadd231ps_fma(auVar81,auVar88,auVar84);
            auVar76 = vfmadd231ps_fma(auVar81,auVar89,auVar85);
            auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xa0);
            auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xb0);
            auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xc0);
            auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xd0);
            auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xe0);
            auVar77 = vfmadd231ps_fma(auVar77,auVar81,*(undefined1 (*) [16])((long)pvVar69 + lVar47)
                                     );
            auVar86 = vfmadd231ps_fma(auVar77,auVar82,auVar86);
            auVar86 = vfmadd231ps_fma(auVar86,auVar83,auVar87);
            auVar86 = vfmadd231ps_fma(auVar86,auVar84,auVar88);
            auVar77 = vfmadd231ps_fma(auVar86,auVar85,auVar89);
            auVar86 = *(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x10);
            auVar87 = *(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x20);
            auVar88 = *(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x30);
            auVar89 = *(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x40);
            auVar81 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)pvVar66 + lVar47),auVar81
                                     );
            auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar82);
            auVar81 = vfmadd231ps_fma(auVar81,auVar87,auVar83);
            auVar81 = vfmadd231ps_fma(auVar81,auVar88,auVar84);
            auVar76 = vfmadd231ps_fma(auVar81,auVar89,auVar85);
            auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xf0);
            auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x100);
            auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x110);
            auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x120);
            auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x130);
            auVar77 = vfmadd231ps_fma(auVar77,auVar81,*(undefined1 (*) [16])((long)pvVar66 + lVar47)
                                     );
            auVar86 = vfmadd231ps_fma(auVar77,auVar82,auVar86);
            auVar86 = vfmadd231ps_fma(auVar86,auVar83,auVar87);
            auVar86 = vfmadd231ps_fma(auVar86,auVar84,auVar88);
            auVar77 = vfmadd231ps_fma(auVar86,auVar85,auVar89);
            auVar86 = *(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x10);
            auVar87 = *(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x20);
            auVar88 = *(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x30);
            auVar89 = *(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x40);
            auVar81 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)piVar49 + lVar47),auVar81
                                     );
            auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar82);
            auVar81 = vfmadd231ps_fma(auVar81,auVar87,auVar83);
            auVar81 = vfmadd231ps_fma(auVar81,auVar88,auVar84);
            auVar76 = vfmadd231ps_fma(auVar81,auVar89,auVar85);
            auVar81 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x140);
            auVar82 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x150);
            auVar83 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x160);
            auVar84 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x170);
            auVar85 = *(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x180);
            auVar77 = vfmadd231ps_fma(auVar77,auVar81,*(undefined1 (*) [16])((long)piVar49 + lVar47)
                                     );
            auVar86 = vfmadd231ps_fma(auVar77,auVar82,auVar86);
            auVar86 = vfmadd231ps_fma(auVar86,auVar83,auVar87);
            auVar86 = vfmadd231ps_fma(auVar86,auVar84,auVar88);
            auVar81 = vfmadd231ps_fma(auVar76,auVar81,*(undefined1 (*) [16])((long)pvVar39 + lVar47)
                                     );
            auVar81 = vfmadd231ps_fma(auVar81,auVar82,
                                      *(undefined1 (*) [16])((long)pvVar39 + lVar47 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,auVar83,
                                      *(undefined1 (*) [16])((long)pvVar39 + lVar47 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,auVar84,
                                      *(undefined1 (*) [16])((long)pvVar39 + lVar47 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,auVar85,
                                      *(undefined1 (*) [16])((long)pvVar39 + lVar47 + 0x40));
            auVar82 = vfmadd231ps_fma(auVar86,auVar85,auVar89);
            *(undefined1 (*) [16])((long)pvVar65 + lVar47) = auVar82;
            *(undefined1 (*) [16])((long)pvVar71 + lVar47) = auVar81;
            lVar47 = lVar47 + 0x10;
          }
          ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar47 + lVar58);
          ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar47 + lVar58);
          pvVar69 = (void *)((long)pvVar69 + lVar47 + lVar58);
          pvVar66 = (void *)((long)pvVar66 + lVar47 + lVar58);
          piVar49 = (pointer)((long)piVar49 + lVar47 + lVar58);
          pvVar39 = (void *)((long)pvVar39 + lVar47 + lVar58);
          pvVar65 = (void *)((long)pvVar65 + lVar47 + lVar53);
          pvVar71 = (void *)((long)pvVar71 + lVar47 + lVar53);
        }
        for (; (int)uVar45 < iVar33; uVar45 = uVar45 + 1) {
          lVar47 = 0;
          uVar35 = uVar36;
          while (bVar74 = uVar35 != 0, uVar35 = uVar35 - 1, bVar74) {
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar56),auVar90,
                                      *(undefined1 (*) [16])((long)ppp_Var43 + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x10),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x20),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x30),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x40),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar47));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x50),auVar81,
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x60),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x70),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x80),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 6) + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x90),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 8) + lVar47));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xa0),auVar81,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xb0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xc0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xd0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xe0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar47 + 0x40));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0xf0),auVar81,
                                      *(undefined1 (*) [16])((long)pvVar66 + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x100)
                                      ,*(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x110)
                                      ,*(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x120)
                                      ,*(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x130)
                                      ,*(undefined1 (*) [16])((long)pvVar66 + lVar47 + 0x40));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x140),auVar81
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar47));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x150)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x160)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x170)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar56 + 0x180)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar47 + 0x40));
            *(undefined1 (*) [16])((long)pvVar65 + lVar47) = auVar81;
            lVar47 = lVar47 + 0x10;
          }
          ppp_Var43 = (_func_int ***)((long)(ppp_Var43 + 8) + lVar47);
          ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 8) + lVar47);
          pvVar69 = (void *)((long)pvVar69 + lVar47 + 0x40);
          pvVar66 = (void *)((long)pvVar66 + lVar47 + 0x40);
          piVar49 = (pointer)((long)piVar49 + lVar47 + 0x40);
          pvVar65 = (void *)((long)pvVar65 + lVar47);
        }
      }
      goto LAB_003a4190;
    }
    if ((((iVar37 == 5 && iVar33 == 5) && uVar36 == 0) && uVar57 == 0) &&
        (iVar38 == 2 && iVar51 == 2)) {
      uVar45 = top_blob->w;
      pvVar63 = (this->super_ConvolutionDepthWise).bias_data.data;
      uVar64 = 0;
      uVar68 = (ulong)uVar45;
      if ((int)uVar45 < 1) {
        uVar68 = uVar64;
      }
      iVar33 = top_blob->h;
      if (top_blob->h < 1) {
        iVar33 = 0;
      }
      uVar44 = (ulong)(uint)local_228.c;
      if (local_228.c < 1) {
        uVar44 = uVar64;
      }
      lVar53 = (long)(int)((local_228.w - uVar45) * 8) * 4;
      for (; uVar64 != uVar44; uVar64 = uVar64 + 1) {
        if (pvVar63 == (void *)0x0) {
          auVar90 = ZEXT816(0) << 0x40;
        }
        else {
          auVar90 = *(undefined1 (*) [16])((long)pvVar63 + uVar64 * 0x10);
        }
        pauVar60 = (undefined1 (*) [16])
                   (top_blob->cstep * uVar64 * top_blob->elemsize + (long)top_blob->data);
        pvVar14 = (this->weight_data_tm).data;
        lVar47 = (long)(this->weight_data_tm).w * uVar64 * (this->weight_data_tm).elemsize;
        ppp_Var43 = (_func_int ***)
                    ((long)(_func_int ***)local_228.data +
                    local_228.cstep * uVar64 * local_228.elemsize);
        lVar58 = (long)local_228.w * local_228.elemsize;
        ppp_Var41 = (_func_int ***)((long)ppp_Var43 + lVar58);
        pvVar69 = (void *)((long)ppp_Var43 + lVar58 * 2);
        pvVar39 = (void *)((long)ppp_Var43 + lVar58 * 3);
        piVar49 = (pointer)((long)ppp_Var43 + lVar58 * 4);
        for (iVar46 = 0; iVar46 != iVar33; iVar46 = iVar46 + 1) {
          lVar58 = 0;
          uVar72 = uVar68;
          while (iVar55 = (int)uVar72, uVar72 = (ulong)(iVar55 - 1), iVar55 != 0) {
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar47),auVar90,
                                      *(undefined1 (*) [16])((long)ppp_Var43 + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x10),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 2) + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x20),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 4) + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x30),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 6) + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x40),
                                      *(undefined1 (*) [16])((long)(ppp_Var43 + 8) + lVar58));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x50),auVar81,
                                      *(undefined1 (*) [16])((long)ppp_Var41 + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x60),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 2) + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x70),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 4) + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x80),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 6) + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x90),
                                      *(undefined1 (*) [16])((long)(ppp_Var41 + 8) + lVar58));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0xa0),auVar81,
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0xb0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0xc0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0xd0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0xe0),
                                      *(undefined1 (*) [16])((long)pvVar69 + lVar58 + 0x40));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0xf0),auVar81,
                                      *(undefined1 (*) [16])((long)pvVar39 + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x100)
                                      ,*(undefined1 (*) [16])((long)pvVar39 + lVar58 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x110)
                                      ,*(undefined1 (*) [16])((long)pvVar39 + lVar58 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x120)
                                      ,*(undefined1 (*) [16])((long)pvVar39 + lVar58 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x130)
                                      ,*(undefined1 (*) [16])((long)pvVar39 + lVar58 + 0x40));
            auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x140),auVar81
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar58));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x150)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar58 + 0x10));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x160)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar58 + 0x20));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x170)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar58 + 0x30));
            auVar81 = vfmadd231ps_fma(auVar81,*(undefined1 (*) [16])((long)pvVar14 + lVar47 + 0x180)
                                      ,*(undefined1 (*) [16])((long)piVar49 + lVar58 + 0x40));
            *pauVar60 = auVar81;
            pauVar60 = pauVar60 + 1;
            lVar58 = lVar58 + 0x20;
          }
          ppp_Var43 = (_func_int ***)((long)ppp_Var43 + lVar58 + lVar53);
          ppp_Var41 = (_func_int ***)((long)ppp_Var41 + lVar58 + lVar53);
          pvVar69 = (void *)((long)pvVar69 + lVar58 + lVar53);
          pvVar39 = (void *)((long)pvVar39 + lVar58 + lVar53);
          piVar49 = (pointer)((long)piVar49 + lVar58 + lVar53);
        }
      }
      goto LAB_003a4190;
    }
    uVar36 = iVar37 * iVar33;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar36,(allocator_type *)&opt_p);
    iVar33 = (this->super_ConvolutionDepthWise).dilation_h;
    iVar37 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar38 = (this->super_ConvolutionDepthWise).dilation_w * iVar37;
    lVar53 = 0;
    iVar51 = 0;
    for (iVar52 = 0; iVar52 < (this->super_ConvolutionDepthWise).kernel_h; iVar52 = iVar52 + 1) {
      for (lVar58 = 0; (int)lVar58 < iVar37; lVar58 = lVar58 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar53 + lVar58] = iVar51;
        iVar51 = iVar51 + (this->super_ConvolutionDepthWise).dilation_w;
        iVar37 = (this->super_ConvolutionDepthWise).kernel_w;
      }
      iVar51 = iVar51 + (iVar12 * iVar33 - iVar38);
      lVar53 = (int)lVar53 + lVar58;
    }
    uVar44 = 0;
    uVar68 = (ulong)uVar36;
    if ((int)uVar36 < 1) {
      uVar68 = uVar44;
    }
    if ((int)uVar45 < 1) {
      uVar64 = uVar44;
    }
    auVar79._8_4_ = 0x42b0c0a5;
    auVar79._0_8_ = 0x42b0c0a542b0c0a5;
    auVar79._12_4_ = 0x42b0c0a5;
    auVar135._8_4_ = 0xc2b0c0a5;
    auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar135._12_4_ = 0xc2b0c0a5;
    auVar80._8_4_ = 0x3f000000;
    auVar80._0_8_ = 0x3f0000003f000000;
    auVar80._12_4_ = 0x3f000000;
    auVar138._8_4_ = 0x3fb8aa3b;
    auVar138._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar138._12_4_ = 0x3fb8aa3b;
    auVar139._8_4_ = 0x3f800000;
    auVar139._0_8_ = 0x3f8000003f800000;
    auVar139._12_4_ = 0x3f800000;
    auVar75._8_4_ = 0x3f318000;
    auVar75._0_8_ = 0x3f3180003f318000;
    auVar75._12_4_ = 0x3f318000;
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar146._8_4_ = 0x3ab743ce;
    auVar146._0_8_ = 0x3ab743ce3ab743ce;
    auVar146._12_4_ = 0x3ab743ce;
    auVar147._8_4_ = 0x3c088908;
    auVar147._0_8_ = 0x3c0889083c088908;
    auVar147._12_4_ = 0x3c088908;
    auVar148._8_4_ = 0x3d2aa9c1;
    auVar148._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar148._12_4_ = 0x3d2aa9c1;
    auVar149._8_4_ = 0x3e2aaaaa;
    auVar149._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar149._12_4_ = 0x3e2aaaaa;
    auVar150._8_4_ = 0x3f800000;
    auVar150._0_8_ = 0x3f8000003f800000;
    auVar150._12_4_ = 0x3f800000;
    auVar151._8_4_ = 0xb95e8083;
    auVar151._0_8_ = 0xb95e8083b95e8083;
    auVar151._12_4_ = 0xb95e8083;
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar90 = vxorps_avx512vl(auVar90,auVar90);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    for (uVar72 = 0; uVar72 != uVar64; uVar72 = uVar72 + 1) {
      pvVar63 = (void *)(top_blob->cstep * uVar72 * top_blob->elemsize + (long)top_blob->data);
      pvVar69 = (this->weight_data_tm).data;
      for (iVar33 = 0; iVar33 <= iVar55; iVar33 = iVar33 + 1) {
        for (lVar53 = 0; lVar53 <= iVar46; lVar53 = lVar53 + 1) {
          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
            auVar100 = ZEXT816(0) << 0x40;
          }
          else {
            auVar100 = *(undefined1 (*) [16])
                        ((long)(this->super_ConvolutionDepthWise).bias_data.data + uVar72 * 0x10);
          }
          for (lVar58 = 0; uVar68 * 4 != lVar58; lVar58 = lVar58 + 4) {
            auVar100 = vfmadd231ps_fma(auVar100,*(undefined1 (*) [16])
                                                 ((long)pvVar69 + lVar58 * 4 + (long)(int)uVar44 * 4
                                                 ),
                                       *(undefined1 (*) [16])
                                        ((long)&((Allocator *)
                                                ((long)local_228.data +
                                                (long)*(int *)((long)_space_ofs.
                                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar58)
                                                * 2 * 8))->_vptr_Allocator +
                                        (long)((this->super_ConvolutionDepthWise).stride_w *
                                               (int)lVar53 * 4) * 4 +
                                        (long)iVar33 *
                                        (long)(this->super_ConvolutionDepthWise).stride_h *
                                        (long)local_228.w * local_228.elemsize +
                                        local_228.cstep * uVar72 * local_228.elemsize));
          }
          iVar37 = (this->super_ConvolutionDepthWise).activation_type;
          auVar92 = auVar100;
          if (iVar37 - 1U < 6) {
            auVar92 = vmaxps_avx512vl(auVar100,auVar90);
            switch(iVar37) {
            case 2:
              auVar100 = vminps_avx512vl(auVar100,auVar90);
              uVar2 = *(this->super_ConvolutionDepthWise).activation_params.data;
              auVar27._4_4_ = uVar2;
              auVar27._0_4_ = uVar2;
              auVar27._8_4_ = uVar2;
              auVar27._12_4_ = uVar2;
              auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,auVar27);
              break;
            case 3:
              puVar18 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
              uVar2 = *puVar18;
              auVar25._4_4_ = uVar2;
              auVar25._0_4_ = uVar2;
              auVar25._8_4_ = uVar2;
              auVar25._12_4_ = uVar2;
              auVar100 = vmaxps_avx512vl(auVar100,auVar25);
              uVar2 = puVar18[1];
              auVar26._4_4_ = uVar2;
              auVar26._0_4_ = uVar2;
              auVar26._8_4_ = uVar2;
              auVar26._12_4_ = uVar2;
              auVar92 = vminps_avx512vl(auVar100,auVar26);
              break;
            case 4:
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar100 = vxorps_avx512vl(auVar100,auVar23);
              auVar100 = vminps_avx(auVar100,auVar79);
              auVar92 = vmaxps_avx(auVar100,auVar135);
              auVar95 = vfmadd231ps_fma(auVar80,auVar92,auVar138);
              auVar155._0_4_ = (int)auVar95._0_4_;
              auVar155._4_4_ = (int)auVar95._4_4_;
              auVar155._8_4_ = (int)auVar95._8_4_;
              auVar155._12_4_ = (int)auVar95._12_4_;
              auVar100 = vcvtdq2ps_avx(auVar155);
              uVar34 = vcmpps_avx512vl(auVar95,auVar100,1);
              auVar95 = vsubps_avx512vl(auVar100,auVar139);
              bVar74 = (bool)((byte)uVar34 & 1);
              auVar101._0_4_ =
                   (float)((uint)bVar74 * auVar95._0_4_ | (uint)!bVar74 * auVar100._0_4_);
              bVar74 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar101._4_4_ =
                   (float)((uint)bVar74 * auVar95._4_4_ | (uint)!bVar74 * auVar100._4_4_);
              bVar74 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar101._8_4_ =
                   (float)((uint)bVar74 * auVar95._8_4_ | (uint)!bVar74 * auVar100._8_4_);
              bVar74 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar101._12_4_ =
                   (float)((uint)bVar74 * auVar95._12_4_ | (uint)!bVar74 * auVar100._12_4_);
              auVar100 = vfmsub231ps_fma(auVar92,auVar101,auVar75);
              auVar24._8_4_ = 0x395e8083;
              auVar24._0_8_ = 0x395e8083395e8083;
              auVar24._12_4_ = 0x395e8083;
              auVar92 = vfmsub231ps_avx512vl(auVar100,auVar101,auVar24);
              auVar141._0_4_ = auVar92._0_4_ * auVar92._0_4_;
              auVar141._4_4_ = auVar92._4_4_ * auVar92._4_4_;
              auVar141._8_4_ = auVar92._8_4_ * auVar92._8_4_;
              auVar141._12_4_ = auVar92._12_4_ * auVar92._12_4_;
              auVar100 = vfmadd213ps_fma(auVar81,auVar92,auVar146);
              auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar147);
              auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar148);
              auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar149);
              auVar100 = vfmadd213ps_fma(auVar100,auVar92,auVar80);
              auVar100 = vfmadd213ps_fma(auVar100,auVar141,auVar92);
              auVar132._0_4_ = auVar100._0_4_ + 1.0;
              auVar132._4_4_ = auVar100._4_4_ + 1.0;
              auVar132._8_4_ = auVar100._8_4_ + 1.0;
              auVar132._12_4_ = auVar100._12_4_ + 1.0;
              auVar100._0_4_ = (int)auVar101._0_4_;
              auVar100._4_4_ = (int)auVar101._4_4_;
              auVar100._8_4_ = (int)auVar101._8_4_;
              auVar100._12_4_ = (int)auVar101._12_4_;
              auVar100 = vpslld_avx(auVar100,0x17);
              auVar100 = vpaddd_avx(auVar150,auVar100);
              auVar100 = vfmadd213ps_fma(auVar100,auVar132,auVar139);
              auVar92 = vdivps_avx(auVar139,auVar100);
              break;
            case 5:
              auVar92 = vminps_avx(auVar100,auVar79);
              auVar95 = vmaxps_avx(auVar92,auVar135);
              auVar93 = vfmadd213ps_fma(auVar138,auVar95,auVar80);
              auVar152._0_4_ = (int)auVar93._0_4_;
              auVar152._4_4_ = (int)auVar93._4_4_;
              auVar152._8_4_ = (int)auVar93._8_4_;
              auVar152._12_4_ = (int)auVar93._12_4_;
              auVar92 = vcvtdq2ps_avx(auVar152);
              uVar34 = vcmpps_avx512vl(auVar93,auVar92,1);
              auVar93 = vsubps_avx512vl(auVar92,auVar139);
              bVar74 = (bool)((byte)uVar34 & 1);
              auVar94._0_4_ = (float)((uint)bVar74 * auVar93._0_4_ | (uint)!bVar74 * auVar92._0_4_);
              bVar74 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar94._4_4_ = (float)((uint)bVar74 * auVar93._4_4_ | (uint)!bVar74 * auVar92._4_4_);
              bVar74 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar94._8_4_ = (float)((uint)bVar74 * auVar93._8_4_ | (uint)!bVar74 * auVar92._8_4_);
              bVar74 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar94._12_4_ =
                   (float)((uint)bVar74 * auVar93._12_4_ | (uint)!bVar74 * auVar92._12_4_);
              auVar92 = vfmsub231ps_fma(auVar95,auVar94,auVar75);
              auVar92 = vfnmsub231ps_fma(auVar92,auVar94,auVar151);
              auVar142._0_4_ = auVar92._0_4_ * auVar92._0_4_;
              auVar142._4_4_ = auVar92._4_4_ * auVar92._4_4_;
              auVar142._8_4_ = auVar92._8_4_ * auVar92._8_4_;
              auVar142._12_4_ = auVar92._12_4_ * auVar92._12_4_;
              auVar95 = vfmadd213ps_avx512vl(auVar81,auVar92,auVar146);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar147);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar148);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar149);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar80);
              auVar92 = vfmadd213ps_avx512vl(auVar95,auVar142,auVar92);
              auVar95 = vaddps_avx512vl(auVar92,auVar139);
              auVar143._0_4_ = (int)auVar94._0_4_;
              auVar143._4_4_ = (int)auVar94._4_4_;
              auVar143._8_4_ = (int)auVar94._8_4_;
              auVar143._12_4_ = (int)auVar94._12_4_;
              auVar92 = vpslld_avx(auVar143,0x17);
              auVar92 = vpaddd_avx(auVar92,auVar150);
              auVar92 = vfmadd213ps_fma(auVar92,auVar95,auVar139);
              uVar34 = vcmpps_avx512vl(auVar92,auVar90,2);
              auVar20._8_4_ = 0x800000;
              auVar20._0_8_ = 0x80000000800000;
              auVar20._12_4_ = 0x800000;
              auVar92 = vmaxps_avx512vl(auVar92,auVar20);
              auVar93 = vpsrld_avx(auVar92,0x17);
              auVar153._8_4_ = 0x807fffff;
              auVar153._0_8_ = 0x807fffff807fffff;
              auVar153._12_4_ = 0x807fffff;
              auVar21._8_4_ = 0x3f000000;
              auVar21._0_8_ = 0x3f0000003f000000;
              auVar21._12_4_ = 0x3f000000;
              auVar92 = vpternlogd_avx512vl(auVar92,auVar153,auVar21,0xea);
              uVar19 = vcmpps_avx512vl(auVar92,auVar82,1);
              auVar95 = vaddps_avx512vl(auVar92,auVar83);
              auVar92 = vaddps_avx512vl(auVar95,auVar92);
              bVar74 = (bool)((byte)uVar19 & 1);
              auVar96._0_4_ = (float)((uint)bVar74 * auVar92._0_4_ | (uint)!bVar74 * auVar95._0_4_);
              bVar74 = (bool)((byte)(uVar19 >> 1) & 1);
              auVar96._4_4_ = (float)((uint)bVar74 * auVar92._4_4_ | (uint)!bVar74 * auVar95._4_4_);
              bVar74 = (bool)((byte)(uVar19 >> 2) & 1);
              auVar96._8_4_ = (float)((uint)bVar74 * auVar92._8_4_ | (uint)!bVar74 * auVar95._8_4_);
              bVar74 = (bool)((byte)(uVar19 >> 3) & 1);
              auVar96._12_4_ =
                   (float)((uint)bVar74 * auVar92._12_4_ | (uint)!bVar74 * auVar95._12_4_);
              auVar140._0_4_ = auVar96._0_4_ * auVar96._0_4_;
              auVar140._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar140._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar140._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar92 = vfmadd213ps_avx512vl(auVar84,auVar96,auVar85);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar86);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar87);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar88);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar89);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar76);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar77);
              auVar92 = vfmadd213ps_avx512vl(auVar92,auVar96,auVar78);
              auVar95 = vmulps_avx512vl(auVar140,auVar96);
              auVar95 = vmulps_avx512vl(auVar95,auVar92);
              auVar22._8_4_ = 0xffffff82;
              auVar22._0_8_ = 0xffffff82ffffff82;
              auVar22._12_4_ = 0xffffff82;
              auVar92 = vpaddd_avx512vl(auVar93,auVar22);
              auVar92 = vcvtdq2ps_avx(auVar92);
              auVar93 = vsubps_avx512vl(auVar92,auVar139);
              bVar74 = (bool)((byte)uVar19 & 1);
              auVar97._0_4_ = (uint)bVar74 * auVar93._0_4_ | (uint)!bVar74 * auVar92._0_4_;
              bVar74 = (bool)((byte)(uVar19 >> 1) & 1);
              auVar97._4_4_ = (uint)bVar74 * auVar93._4_4_ | (uint)!bVar74 * auVar92._4_4_;
              bVar74 = (bool)((byte)(uVar19 >> 2) & 1);
              auVar97._8_4_ = (uint)bVar74 * auVar93._8_4_ | (uint)!bVar74 * auVar92._8_4_;
              bVar74 = (bool)((byte)(uVar19 >> 3) & 1);
              auVar97._12_4_ = (uint)bVar74 * auVar93._12_4_ | (uint)!bVar74 * auVar92._12_4_;
              auVar92 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar151);
              auVar92 = vfmsub231ps_avx512vl(auVar92,auVar80,auVar140);
              auVar92 = vsubps_avx512vl(auVar92,auVar96);
              auVar92 = vfnmadd231ps_fma(auVar92,auVar75,auVar97);
              auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar74 = (bool)((byte)uVar34 & 1);
              auVar98._0_4_ =
                   (uint)bVar74 * auVar95._0_4_ |
                   (uint)!bVar74 * (int)(auVar92._0_4_ + auVar92._0_4_);
              bVar74 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar98._4_4_ =
                   (uint)bVar74 * auVar95._4_4_ |
                   (uint)!bVar74 * (int)(auVar92._4_4_ + auVar92._4_4_);
              bVar74 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar98._8_4_ =
                   (uint)bVar74 * auVar95._8_4_ |
                   (uint)!bVar74 * (int)(auVar92._8_4_ + auVar92._8_4_);
              bVar74 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar98._12_4_ =
                   (uint)bVar74 * auVar95._12_4_ |
                   (uint)!bVar74 * (int)(auVar92._12_4_ + auVar92._12_4_);
              auVar92 = vminps_avx(auVar98,auVar79);
              auVar95 = vmaxps_avx(auVar92,auVar135);
              auVar93 = vfmadd213ps_fma(auVar138,auVar95,auVar80);
              auVar154._0_4_ = (int)auVar93._0_4_;
              auVar154._4_4_ = (int)auVar93._4_4_;
              auVar154._8_4_ = (int)auVar93._8_4_;
              auVar154._12_4_ = (int)auVar93._12_4_;
              auVar92 = vcvtdq2ps_avx(auVar154);
              uVar34 = vcmpps_avx512vl(auVar93,auVar92,1);
              auVar93 = vsubps_avx512vl(auVar92,auVar139);
              bVar74 = (bool)((byte)uVar34 & 1);
              auVar99._0_4_ = (float)((uint)bVar74 * auVar93._0_4_ | (uint)!bVar74 * auVar92._0_4_);
              bVar74 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar99._4_4_ = (float)((uint)bVar74 * auVar93._4_4_ | (uint)!bVar74 * auVar92._4_4_);
              bVar74 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar99._8_4_ = (float)((uint)bVar74 * auVar93._8_4_ | (uint)!bVar74 * auVar92._8_4_);
              bVar74 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar99._12_4_ =
                   (float)((uint)bVar74 * auVar93._12_4_ | (uint)!bVar74 * auVar92._12_4_);
              auVar92 = vfmsub231ps_fma(auVar95,auVar99,auVar75);
              auVar92 = vfnmsub231ps_fma(auVar92,auVar99,auVar151);
              auVar144._0_4_ = auVar92._0_4_ * auVar92._0_4_;
              auVar144._4_4_ = auVar92._4_4_ * auVar92._4_4_;
              auVar144._8_4_ = auVar92._8_4_ * auVar92._8_4_;
              auVar144._12_4_ = auVar92._12_4_ * auVar92._12_4_;
              auVar95 = vfmadd213ps_avx512vl(auVar81,auVar92,auVar146);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar147);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar148);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar149);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar80);
              auVar92 = vfmadd213ps_avx512vl(auVar95,auVar144,auVar92);
              auVar95 = vaddps_avx512vl(auVar92,auVar139);
              auVar145._0_4_ = (int)auVar99._0_4_;
              auVar145._4_4_ = (int)auVar99._4_4_;
              auVar145._8_4_ = (int)auVar99._8_4_;
              auVar145._12_4_ = (int)auVar99._12_4_;
              auVar92 = vpslld_avx(auVar145,0x17);
              auVar92 = vpaddd_avx(auVar92,auVar150);
              auVar92 = vfmadd213ps_fma(auVar92,auVar95,auVar139);
              auVar92 = vdivps_avx512vl(auVar91,auVar92);
              auVar92 = vfmsub213ps_fma(auVar92,auVar100,auVar100);
              break;
            case 6:
              puVar18 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
              uVar2 = *puVar18;
              auVar93._4_4_ = uVar2;
              auVar93._0_4_ = uVar2;
              auVar93._8_4_ = uVar2;
              auVar93._12_4_ = uVar2;
              uVar2 = puVar18[1];
              auVar95._4_4_ = uVar2;
              auVar95._0_4_ = uVar2;
              auVar95._8_4_ = uVar2;
              auVar95._12_4_ = uVar2;
              auVar92 = vfmadd213ps_avx512vl(auVar93,auVar100,auVar95);
              auVar92 = vmaxps_avx512vl(auVar92,auVar90);
              auVar95 = vminps_avx(auVar92,auVar139);
              auVar92._0_4_ = auVar95._0_4_ * auVar100._0_4_;
              auVar92._4_4_ = auVar95._4_4_ * auVar100._4_4_;
              auVar92._8_4_ = auVar95._8_4_ * auVar100._8_4_;
              auVar92._12_4_ = auVar95._12_4_ * auVar100._12_4_;
            }
          }
          *(undefined1 (*) [16])((long)pvVar63 + lVar53 * 0x10) = auVar92;
        }
        pvVar63 = (void *)((long)pvVar63 + (long)(iVar50 * 4) * 4);
      }
      uVar44 = (ulong)((int)uVar44 + uVar36 * 4);
    }
LAB_003a4b29:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  iVar38 = 0;
LAB_003a4c0e:
  piVar16 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        free(local_228.data);
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar38;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}